

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  RTCRayQueryContext *pRVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  byte bVar64;
  byte bVar65;
  ulong uVar66;
  byte bVar67;
  byte bVar68;
  long lVar69;
  uint uVar70;
  byte bVar71;
  uint uVar72;
  long lVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  ulong uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar141;
  uint uVar142;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar148;
  float fVar149;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar167;
  float fVar168;
  undefined4 uVar169;
  float fVar184;
  float fVar186;
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar180 [32];
  undefined1 auVar173 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  vint4 ai_2;
  undefined1 auVar246 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  vint4 ai_1;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  vint4 ai;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [28];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar282 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_af4;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 (*local_848) [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  Primitive *local_6d0;
  ulong local_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  RTCHitN local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar66 = (ulong)(byte)PVar6;
  lVar73 = uVar66 * 0x25;
  fVar148 = *(float *)(prim + lVar73 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar73 + 6));
  auVar221._0_4_ = fVar148 * auVar83._0_4_;
  auVar221._4_4_ = fVar148 * auVar83._4_4_;
  auVar221._8_4_ = fVar148 * auVar83._8_4_;
  auVar221._12_4_ = fVar148 * auVar83._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar150._0_4_ = fVar148 * auVar82._0_4_;
  auVar150._4_4_ = fVar148 * auVar82._4_4_;
  auVar150._8_4_ = fVar148 * auVar82._8_4_;
  auVar150._12_4_ = fVar148 * auVar82._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar66 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar251._4_4_ = auVar150._0_4_;
  auVar251._0_4_ = auVar150._0_4_;
  auVar251._8_4_ = auVar150._0_4_;
  auVar251._12_4_ = auVar150._0_4_;
  auVar90 = vshufps_avx(auVar150,auVar150,0x55);
  auVar92 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar148 = auVar92._0_4_;
  auVar196._0_4_ = fVar148 * auVar85._0_4_;
  fVar167 = auVar92._4_4_;
  auVar196._4_4_ = fVar167 * auVar85._4_4_;
  fVar184 = auVar92._8_4_;
  auVar196._8_4_ = fVar184 * auVar85._8_4_;
  fVar186 = auVar92._12_4_;
  auVar196._12_4_ = fVar186 * auVar85._12_4_;
  auVar170._0_4_ = auVar87._0_4_ * fVar148;
  auVar170._4_4_ = auVar87._4_4_ * fVar167;
  auVar170._8_4_ = auVar87._8_4_ * fVar184;
  auVar170._12_4_ = auVar87._12_4_ * fVar186;
  auVar151._0_4_ = auVar89._0_4_ * fVar148;
  auVar151._4_4_ = auVar89._4_4_ * fVar167;
  auVar151._8_4_ = auVar89._8_4_ * fVar184;
  auVar151._12_4_ = auVar89._12_4_ * fVar186;
  auVar92 = vfmadd231ps_fma(auVar196,auVar90,auVar82);
  auVar91 = vfmadd231ps_fma(auVar170,auVar90,auVar24);
  auVar90 = vfmadd231ps_fma(auVar151,auVar84,auVar90);
  auVar93 = vfmadd231ps_fma(auVar92,auVar251,auVar83);
  auVar91 = vfmadd231ps_fma(auVar91,auVar251,auVar86);
  auVar94 = vfmadd231ps_fma(auVar90,auVar88,auVar251);
  auVar277._4_4_ = auVar221._0_4_;
  auVar277._0_4_ = auVar221._0_4_;
  auVar277._8_4_ = auVar221._0_4_;
  auVar277._12_4_ = auVar221._0_4_;
  auVar90 = vshufps_avx(auVar221,auVar221,0x55);
  auVar279 = ZEXT1664(auVar90);
  auVar92 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar148 = auVar92._0_4_;
  auVar252._0_4_ = fVar148 * auVar85._0_4_;
  fVar167 = auVar92._4_4_;
  auVar252._4_4_ = fVar167 * auVar85._4_4_;
  fVar184 = auVar92._8_4_;
  auVar252._8_4_ = fVar184 * auVar85._8_4_;
  fVar186 = auVar92._12_4_;
  auVar252._12_4_ = fVar186 * auVar85._12_4_;
  auVar239._0_4_ = auVar87._0_4_ * fVar148;
  auVar239._4_4_ = auVar87._4_4_ * fVar167;
  auVar239._8_4_ = auVar87._8_4_ * fVar184;
  auVar239._12_4_ = auVar87._12_4_ * fVar186;
  auVar222._0_4_ = auVar89._0_4_ * fVar148;
  auVar222._4_4_ = auVar89._4_4_ * fVar167;
  auVar222._8_4_ = auVar89._8_4_ * fVar184;
  auVar222._12_4_ = auVar89._12_4_ * fVar186;
  auVar82 = vfmadd231ps_fma(auVar252,auVar90,auVar82);
  auVar85 = vfmadd231ps_fma(auVar239,auVar90,auVar24);
  auVar24 = vfmadd231ps_fma(auVar222,auVar90,auVar84);
  auVar31 = vfmadd231ps_fma(auVar82,auVar277,auVar83);
  auVar150 = vfmadd231ps_fma(auVar85,auVar277,auVar86);
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar151 = vfmadd231ps_fma(auVar24,auVar277,auVar88);
  auVar83 = vandps_avx(auVar274,auVar93);
  auVar269._8_4_ = 0x219392ef;
  auVar269._0_8_ = 0x219392ef219392ef;
  auVar269._12_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar83,auVar269,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar79._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar93._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar93._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar93._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar93._12_4_;
  auVar83 = vandps_avx(auVar274,auVar91);
  uVar76 = vcmpps_avx512vl(auVar83,auVar269,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar80._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar91._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar91._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar91._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar91._12_4_;
  auVar83 = vandps_avx(auVar274,auVar94);
  uVar76 = vcmpps_avx512vl(auVar83,auVar269,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar81._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._12_4_;
  auVar82 = vrcp14ps_avx512vl(auVar79);
  auVar270._8_4_ = 0x3f800000;
  auVar270._0_8_ = 0x3f8000003f800000;
  auVar270._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar79,auVar82,auVar270);
  auVar93 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar83 = vfnmadd213ps_fma(auVar80,auVar82,auVar270);
  auVar94 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar81);
  auVar83 = vfnmadd213ps_fma(auVar81,auVar82,auVar270);
  auVar30 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  fVar148 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar73 + 0x16)) *
            *(float *)(prim + lVar73 + 0x1a);
  auVar261._4_4_ = fVar148;
  auVar261._0_4_ = fVar148;
  auVar261._8_4_ = fVar148;
  auVar261._12_4_ = fVar148;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar86 = vsubps_avx(auVar82,auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar85);
  auVar85 = vfmadd213ps_fma(auVar86,auVar261,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar82);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar82 = vpmovsxwd_avx(auVar86);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar86 = vfmadd213ps_fma(auVar82,auVar261,auVar83);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar24);
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar76 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar66 * 2 + uVar76 + 6);
  auVar82 = vpmovsxwd_avx(auVar87);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar24 = vfmadd213ps_fma(auVar82,auVar261,auVar83);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar83 = vpmovsxwd_avx(auVar88);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar82 = vpmovsxwd_avx(auVar84);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar87 = vfmadd213ps_fma(auVar82,auVar261,auVar83);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar89);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar82 = vpmovsxwd_avx(auVar90);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar88 = vfmadd213ps_fma(auVar82,auVar261,auVar83);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar66) + 6);
  auVar83 = vpmovsxwd_avx(auVar92);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar82 = vpmovsxwd_avx(auVar91);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar82 = vfmadd213ps_fma(auVar82,auVar261,auVar83);
  auVar83 = vsubps_avx(auVar85,auVar31);
  auVar262._0_4_ = auVar93._0_4_ * auVar83._0_4_;
  auVar262._4_4_ = auVar93._4_4_ * auVar83._4_4_;
  auVar262._8_4_ = auVar93._8_4_ * auVar83._8_4_;
  auVar262._12_4_ = auVar93._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar86,auVar31);
  auVar197._0_4_ = auVar93._0_4_ * auVar83._0_4_;
  auVar197._4_4_ = auVar93._4_4_ * auVar83._4_4_;
  auVar197._8_4_ = auVar93._8_4_ * auVar83._8_4_;
  auVar197._12_4_ = auVar93._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar24,auVar150);
  auVar253._0_4_ = auVar94._0_4_ * auVar83._0_4_;
  auVar253._4_4_ = auVar94._4_4_ * auVar83._4_4_;
  auVar253._8_4_ = auVar94._8_4_ * auVar83._8_4_;
  auVar253._12_4_ = auVar94._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar87,auVar150);
  auVar171._0_4_ = auVar94._0_4_ * auVar83._0_4_;
  auVar171._4_4_ = auVar94._4_4_ * auVar83._4_4_;
  auVar171._8_4_ = auVar94._8_4_ * auVar83._8_4_;
  auVar171._12_4_ = auVar94._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar88,auVar151);
  auVar240._0_4_ = auVar30._0_4_ * auVar83._0_4_;
  auVar240._4_4_ = auVar30._4_4_ * auVar83._4_4_;
  auVar240._8_4_ = auVar30._8_4_ * auVar83._8_4_;
  auVar240._12_4_ = auVar30._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar82,auVar151);
  auVar152._0_4_ = auVar30._0_4_ * auVar83._0_4_;
  auVar152._4_4_ = auVar30._4_4_ * auVar83._4_4_;
  auVar152._8_4_ = auVar30._8_4_ * auVar83._8_4_;
  auVar152._12_4_ = auVar30._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar262,auVar197);
  auVar82 = vpminsd_avx(auVar253,auVar171);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar82 = vpminsd_avx(auVar240,auVar152);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar93._4_4_ = uVar169;
  auVar93._0_4_ = uVar169;
  auVar93._8_4_ = uVar169;
  auVar93._12_4_ = uVar169;
  auVar82 = vmaxps_avx512vl(auVar82,auVar93);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  local_4a0 = vmulps_avx512vl(auVar83,auVar94);
  auVar83 = vpmaxsd_avx(auVar262,auVar197);
  auVar82 = vpmaxsd_avx(auVar253,auVar171);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar82 = vpmaxsd_avx(auVar240,auVar152);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar30._4_4_ = uVar169;
  auVar30._0_4_ = uVar169;
  auVar30._8_4_ = uVar169;
  auVar30._12_4_ = uVar169;
  auVar82 = vminps_avx512vl(auVar82,auVar30);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar31);
  auVar82 = vpbroadcastd_avx512vl();
  uVar27 = vcmpps_avx512vl(local_4a0,auVar83,2);
  local_6c8 = vpcmpgtd_avx512vl(auVar82,_DAT_01f7fcf0);
  local_6c8 = ((byte)uVar27 & 0xf) & local_6c8;
  if ((char)local_6c8 == '\0') {
    return;
  }
  local_848 = (undefined1 (*) [32])&local_320;
  local_480 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6d0 = prim;
LAB_01bdcd74:
  lVar73 = 0;
  for (uVar76 = local_6c8; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  uVar72 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar73 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar72].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar148 = (pGVar9->time_range).lower;
  fVar148 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar148) / ((pGVar9->time_range).upper - fVar148));
  auVar83 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
  auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
  fVar148 = fVar148 - auVar83._0_4_;
  fVar167 = 1.0 - fVar148;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar83._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + 0x10 + lVar69);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar69);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar69);
  pfVar5 = (float *)(lVar12 + lVar13 * uVar76);
  auVar153._0_4_ = fVar148 * *pfVar5;
  auVar153._4_4_ = fVar148 * pfVar5[1];
  auVar153._8_4_ = fVar148 * pfVar5[2];
  auVar153._12_4_ = fVar148 * pfVar5[3];
  lVar73 = uVar76 + 1;
  pfVar5 = (float *)(lVar12 + lVar13 * lVar73);
  auVar172._0_4_ = fVar148 * *pfVar5;
  auVar172._4_4_ = fVar148 * pfVar5[1];
  auVar172._8_4_ = fVar148 * pfVar5[2];
  auVar172._12_4_ = fVar148 * pfVar5[3];
  p_Var14 = pGVar9[4].occlusionFilterN;
  auVar198._4_4_ = fVar167;
  auVar198._0_4_ = fVar167;
  auVar198._8_4_ = fVar167;
  auVar198._12_4_ = fVar167;
  auVar86 = vfmadd231ps_fma(auVar153,auVar198,
                            *(undefined1 (*) [16])(*(long *)(_Var10 + lVar69) + lVar11 * uVar76));
  auVar24 = vfmadd231ps_fma(auVar172,auVar198,
                            *(undefined1 (*) [16])(*(long *)(_Var10 + lVar69) + lVar11 * lVar73));
  pfVar5 = (float *)(*(long *)(p_Var14 + lVar69 + 0x38) +
                    uVar76 * *(long *)(p_Var14 + lVar69 + 0x48));
  auVar241._0_4_ = fVar148 * *pfVar5;
  auVar241._4_4_ = fVar148 * pfVar5[1];
  auVar241._8_4_ = fVar148 * pfVar5[2];
  auVar241._12_4_ = fVar148 * pfVar5[3];
  pfVar5 = (float *)(*(long *)(p_Var14 + lVar69 + 0x38) +
                    *(long *)(p_Var14 + lVar69 + 0x48) * lVar73);
  auVar223._0_4_ = fVar148 * *pfVar5;
  auVar223._4_4_ = fVar148 * pfVar5[1];
  auVar223._8_4_ = fVar148 * pfVar5[2];
  auVar223._12_4_ = fVar148 * pfVar5[3];
  auVar85 = vfmadd231ps_fma(auVar241,auVar198,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var14 + lVar69) +
                             *(long *)(p_Var14 + lVar69 + 0x10) * uVar76));
  auVar87 = vfmadd231ps_fma(auVar223,auVar198,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var14 + lVar69) +
                             *(long *)(p_Var14 + lVar69 + 0x10) * lVar73));
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_500 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar83 = vunpcklps_avx512vl(local_500._0_16_,local_520._0_16_);
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar89 = local_540._0_16_;
  local_7f0 = vinsertps_avx512f(auVar83,auVar89,0x28);
  auVar254._8_4_ = 0xbeaaaaab;
  auVar254._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar254._12_4_ = 0xbeaaaaab;
  auVar88 = vfnmadd213ps_fma(auVar85,auVar254,auVar86);
  auVar85 = vfmadd213ps_fma(auVar87,auVar254,auVar24);
  auVar255._0_4_ = auVar24._0_4_ + auVar86._0_4_ + auVar88._0_4_ + auVar85._0_4_;
  auVar255._4_4_ = auVar24._4_4_ + auVar86._4_4_ + auVar88._4_4_ + auVar85._4_4_;
  auVar255._8_4_ = auVar24._8_4_ + auVar86._8_4_ + auVar88._8_4_ + auVar85._8_4_;
  auVar255._12_4_ = auVar24._12_4_ + auVar86._12_4_ + auVar88._12_4_ + auVar85._12_4_;
  auVar32._8_4_ = 0x3e800000;
  auVar32._0_8_ = 0x3e8000003e800000;
  auVar32._12_4_ = 0x3e800000;
  auVar83 = vmulps_avx512vl(auVar255,auVar32);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar83 = vdpps_avx(auVar83,local_7f0,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0x60);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar263._4_12_ = ZEXT812(0) << 0x20;
  auVar263._0_4_ = local_800._0_4_;
  auVar84 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar263);
  auVar87 = vfnmadd213ss_fma(auVar84,local_800,ZEXT416(0x40000000));
  local_260 = auVar83._0_4_ * auVar84._0_4_ * auVar87._0_4_;
  auVar264._4_4_ = local_260;
  auVar264._0_4_ = local_260;
  auVar264._8_4_ = local_260;
  auVar264._12_4_ = local_260;
  fStack_7b0 = local_260;
  _local_7c0 = auVar264;
  fStack_7ac = local_260;
  fStack_7a8 = local_260;
  fStack_7a4 = local_260;
  auVar83 = vfmadd231ps_fma(auVar82,local_7f0,auVar264);
  auVar83 = vblendps_avx(auVar83,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar86,auVar83);
  auVar85 = vsubps_avx(auVar85,auVar83);
  auVar86 = vsubps_avx(auVar88,auVar83);
  auVar83 = vsubps_avx(auVar24,auVar83);
  auVar95 = vbroadcastss_avx512vl(auVar82);
  auVar282 = ZEXT3264(auVar95);
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  local_640 = ZEXT1632(auVar82);
  auVar95 = vpermps_avx2(auVar101,local_640);
  auVar102._8_4_ = 2;
  auVar102._0_8_ = 0x200000002;
  auVar102._12_4_ = 2;
  auVar102._16_4_ = 2;
  auVar102._20_4_ = 2;
  auVar102._24_4_ = 2;
  auVar102._28_4_ = 2;
  auVar25 = vpermps_avx2(auVar102,local_640);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar26 = vpermps_avx2(auVar105,local_640);
  uVar169 = auVar86._0_4_;
  local_620._4_4_ = uVar169;
  local_620._0_4_ = uVar169;
  local_620._8_4_ = uVar169;
  local_620._12_4_ = uVar169;
  local_620._16_4_ = uVar169;
  local_620._20_4_ = uVar169;
  local_620._24_4_ = uVar169;
  local_620._28_4_ = uVar169;
  auVar268 = ZEXT3264(local_620);
  local_680 = ZEXT1632(auVar86);
  local_7e0 = vpermps_avx2(auVar101,local_680);
  local_8a0 = vpermps_avx2(auVar102,local_680);
  auVar278 = ZEXT3264(local_8a0);
  auVar96 = vpermps_avx512vl(auVar105,local_680);
  auVar249 = ZEXT3264(local_7e0);
  auVar97 = vbroadcastss_avx512vl(auVar85);
  local_660 = ZEXT1632(auVar85);
  auVar98 = vpermps_avx512vl(auVar101,local_660);
  auVar99 = vpermps_avx512vl(auVar102,local_660);
  local_8c0 = vpermps_avx512vl(auVar105,local_660);
  auVar280 = ZEXT3264(local_8c0);
  auVar100 = vbroadcastss_avx512vl(auVar83);
  _local_6a0 = ZEXT1632(auVar83);
  local_8e0 = vpermps_avx512vl(auVar101,_local_6a0);
  auVar281 = ZEXT3264(local_8e0);
  auVar101 = vpermps_avx512vl(auVar102,_local_6a0);
  auVar102 = vpermps_avx512vl(auVar105,_local_6a0);
  auVar83 = vmulss_avx512f(auVar89,auVar89);
  auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),local_520,local_520);
  local_240 = vfmadd231ps_avx512vl(auVar103,_local_500,_local_500);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar103);
  local_730 = ZEXT416((uint)local_260);
  local_260 = fVar148 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_420 = vpbroadcastd_avx512vl();
  uVar70 = 0;
  local_af4 = 1;
  local_440 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_800,local_800);
  auVar82 = vsqrtss_avx(local_800,local_800);
  local_490 = ZEXT816(0x3f80000000000000);
  do {
    auVar85 = vmovshdup_avx(local_490);
    auVar85 = vsubps_avx(auVar85,local_490);
    fVar167 = auVar85._0_4_;
    fVar149 = fVar167 * 0.04761905;
    auVar236._0_4_ = local_490._0_4_;
    auVar236._4_4_ = auVar236._0_4_;
    auVar236._8_4_ = auVar236._0_4_;
    auVar236._12_4_ = auVar236._0_4_;
    auVar236._16_4_ = auVar236._0_4_;
    auVar236._20_4_ = auVar236._0_4_;
    auVar236._24_4_ = auVar236._0_4_;
    auVar236._28_4_ = auVar236._0_4_;
    auVar260._4_4_ = fVar167;
    auVar260._0_4_ = fVar167;
    auVar260._8_4_ = fVar167;
    auVar260._12_4_ = fVar167;
    auVar260._16_4_ = fVar167;
    auVar260._20_4_ = fVar167;
    auVar260._24_4_ = fVar167;
    auVar260._28_4_ = fVar167;
    auVar85 = vfmadd231ps_fma(auVar236,auVar260,_DAT_01faff20);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar103 = vsubps_avx512vl(auVar104,ZEXT1632(auVar85));
    fVar167 = auVar85._0_4_;
    fVar184 = auVar85._4_4_;
    auVar118._4_4_ = auVar268._4_4_ * fVar184;
    auVar118._0_4_ = auVar268._0_4_ * fVar167;
    fVar186 = auVar85._8_4_;
    auVar118._8_4_ = auVar268._8_4_ * fVar186;
    fVar188 = auVar85._12_4_;
    auVar118._12_4_ = auVar268._12_4_ * fVar188;
    auVar118._16_4_ = auVar268._16_4_ * 0.0;
    auVar118._20_4_ = auVar268._20_4_ * 0.0;
    auVar118._24_4_ = auVar268._24_4_ * 0.0;
    auVar118._28_4_ = DAT_01faff20._28_4_;
    auVar107._4_4_ = auVar249._4_4_ * fVar184;
    auVar107._0_4_ = auVar249._0_4_ * fVar167;
    auVar107._8_4_ = auVar249._8_4_ * fVar186;
    auVar107._12_4_ = auVar249._12_4_ * fVar188;
    auVar107._16_4_ = auVar249._16_4_ * 0.0;
    auVar107._20_4_ = auVar249._20_4_ * 0.0;
    auVar107._24_4_ = auVar249._24_4_ * 0.0;
    auVar107._28_4_ = auVar236._0_4_;
    auVar250._0_4_ = auVar278._0_4_ * fVar167;
    auVar250._4_4_ = auVar278._4_4_ * fVar184;
    auVar250._8_4_ = auVar278._8_4_ * fVar186;
    auVar250._12_4_ = auVar278._12_4_ * fVar188;
    auVar250._16_4_ = auVar278._16_4_ * 0.0;
    auVar250._20_4_ = auVar278._20_4_ * 0.0;
    auVar250._28_36_ = auVar249._28_36_;
    auVar250._24_4_ = auVar278._24_4_ * 0.0;
    auVar105 = vmulps_avx512vl(auVar96,ZEXT1632(auVar85));
    local_840 = auVar282._0_32_;
    auVar106 = vfmadd231ps_avx512vl(auVar118,auVar103,local_840);
    auVar86 = vfmadd231ps_fma(auVar107,auVar103,auVar95);
    auVar24 = vfmadd231ps_fma(auVar250._0_32_,auVar103,auVar25);
    auVar87 = vfmadd231ps_fma(auVar105,auVar103,auVar26);
    auVar105 = vmulps_avx512vl(auVar97,ZEXT1632(auVar85));
    auVar113 = ZEXT1632(auVar85);
    auVar107 = vmulps_avx512vl(auVar98,auVar113);
    auVar108 = vmulps_avx512vl(auVar99,auVar113);
    auVar109 = vmulps_avx512vl(auVar280._0_32_,auVar113);
    auVar88 = vfmadd231ps_fma(auVar105,auVar103,auVar268._0_32_);
    auVar84 = vfmadd231ps_fma(auVar107,auVar103,auVar249._0_32_);
    auVar89 = vfmadd231ps_fma(auVar108,auVar103,auVar278._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar96);
    auVar107 = vmulps_avx512vl(auVar100,auVar113);
    auVar108 = vmulps_avx512vl(auVar281._0_32_,auVar113);
    auVar109 = vmulps_avx512vl(auVar101,auVar113);
    auVar110 = vmulps_avx512vl(auVar102,auVar113);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar97);
    auVar111 = vfmadd231ps_avx512vl(auVar108,auVar103,auVar98);
    auVar112 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar99);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,auVar280._0_32_);
    auVar279._0_28_ =
         ZEXT1628(CONCAT412(fVar188 * auVar88._12_4_,
                            CONCAT48(fVar186 * auVar88._8_4_,
                                     CONCAT44(fVar184 * auVar88._4_4_,fVar167 * auVar88._0_4_))));
    auVar108 = vmulps_avx512vl(auVar113,ZEXT1632(auVar84));
    auVar109 = vmulps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar89));
    auVar113 = vmulps_avx512vl(ZEXT1632(auVar85),auVar105);
    auVar85 = vfmadd231ps_fma(auVar279._0_32_,auVar103,auVar106);
    auVar114 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar86));
    auVar115 = vfmadd231ps_avx512vl(auVar109,auVar103,ZEXT1632(auVar24));
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,ZEXT1632(auVar87));
    auVar119._0_4_ = auVar107._0_4_ * fVar167;
    auVar119._4_4_ = auVar107._4_4_ * fVar184;
    auVar119._8_4_ = auVar107._8_4_ * fVar186;
    auVar119._12_4_ = auVar107._12_4_ * fVar188;
    auVar119._16_4_ = auVar107._16_4_ * 0.0;
    auVar119._20_4_ = auVar107._20_4_ * 0.0;
    auVar119._24_4_ = auVar107._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar108._4_4_ = auVar111._4_4_ * fVar184;
    auVar108._0_4_ = auVar111._0_4_ * fVar167;
    auVar108._8_4_ = auVar111._8_4_ * fVar186;
    auVar108._12_4_ = auVar111._12_4_ * fVar188;
    auVar108._16_4_ = auVar111._16_4_ * 0.0;
    auVar108._20_4_ = auVar111._20_4_ * 0.0;
    auVar108._24_4_ = auVar111._24_4_ * 0.0;
    auVar108._28_4_ = auVar107._28_4_;
    auVar109._4_4_ = auVar112._4_4_ * fVar184;
    auVar109._0_4_ = auVar112._0_4_ * fVar167;
    auVar109._8_4_ = auVar112._8_4_ * fVar186;
    auVar109._12_4_ = auVar112._12_4_ * fVar188;
    auVar109._16_4_ = auVar112._16_4_ * 0.0;
    auVar109._20_4_ = auVar112._20_4_ * 0.0;
    auVar109._24_4_ = auVar112._24_4_ * 0.0;
    auVar109._28_4_ = auVar111._28_4_;
    auVar116._4_4_ = auVar110._4_4_ * fVar184;
    auVar116._0_4_ = auVar110._0_4_ * fVar167;
    auVar116._8_4_ = auVar110._8_4_ * fVar186;
    auVar116._12_4_ = auVar110._12_4_ * fVar188;
    auVar116._16_4_ = auVar110._16_4_ * 0.0;
    auVar116._20_4_ = auVar110._20_4_ * 0.0;
    auVar116._24_4_ = auVar110._24_4_ * 0.0;
    auVar116._28_4_ = auVar112._28_4_;
    auVar86 = vfmadd231ps_fma(auVar119,auVar103,ZEXT1632(auVar88));
    auVar24 = vfmadd231ps_fma(auVar108,auVar103,ZEXT1632(auVar84));
    auVar87 = vfmadd231ps_fma(auVar109,auVar103,ZEXT1632(auVar89));
    auVar88 = vfmadd231ps_fma(auVar116,auVar103,auVar105);
    auVar117._28_4_ = auVar106._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(auVar87._12_4_ * fVar188,
                            CONCAT48(auVar87._8_4_ * fVar186,
                                     CONCAT44(auVar87._4_4_ * fVar184,auVar87._0_4_ * fVar167))));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar188 * auVar86._12_4_,
                                                 CONCAT48(fVar186 * auVar86._8_4_,
                                                          CONCAT44(fVar184 * auVar86._4_4_,
                                                                   fVar167 * auVar86._0_4_)))),
                              auVar103,ZEXT1632(auVar85));
    auVar116 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar24._12_4_ * fVar188,
                                             CONCAT48(auVar24._8_4_ * fVar186,
                                                      CONCAT44(auVar24._4_4_ * fVar184,
                                                               auVar24._0_4_ * fVar167)))),auVar103,
                          auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar103,auVar115);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar88._12_4_ * fVar188,
                                             CONCAT48(auVar88._8_4_ * fVar186,
                                                      CONCAT44(auVar88._4_4_ * fVar184,
                                                               auVar88._0_4_ * fVar167)))),auVar113,
                          auVar103);
    auVar103 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar85));
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar24),auVar114);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar87),auVar115);
    auVar109 = vsubps_avx512vl(ZEXT1632(auVar88),auVar113);
    auVar131._0_4_ = fVar149 * auVar103._0_4_ * 3.0;
    auVar131._4_4_ = fVar149 * auVar103._4_4_ * 3.0;
    auVar131._8_4_ = fVar149 * auVar103._8_4_ * 3.0;
    auVar131._12_4_ = fVar149 * auVar103._12_4_ * 3.0;
    auVar131._16_4_ = fVar149 * auVar103._16_4_ * 3.0;
    auVar131._20_4_ = fVar149 * auVar103._20_4_ * 3.0;
    auVar131._24_4_ = fVar149 * auVar103._24_4_ * 3.0;
    auVar131._28_4_ = 0;
    auVar161._0_4_ = fVar149 * auVar107._0_4_ * 3.0;
    auVar161._4_4_ = fVar149 * auVar107._4_4_ * 3.0;
    auVar161._8_4_ = fVar149 * auVar107._8_4_ * 3.0;
    auVar161._12_4_ = fVar149 * auVar107._12_4_ * 3.0;
    auVar161._16_4_ = fVar149 * auVar107._16_4_ * 3.0;
    auVar161._20_4_ = fVar149 * auVar107._20_4_ * 3.0;
    auVar161._24_4_ = fVar149 * auVar107._24_4_ * 3.0;
    auVar161._28_4_ = 0;
    auVar114._4_4_ = fVar149 * auVar108._4_4_ * 3.0;
    auVar114._0_4_ = fVar149 * auVar108._0_4_ * 3.0;
    auVar114._8_4_ = fVar149 * auVar108._8_4_ * 3.0;
    auVar114._12_4_ = fVar149 * auVar108._12_4_ * 3.0;
    auVar114._16_4_ = fVar149 * auVar108._16_4_ * 3.0;
    auVar114._20_4_ = fVar149 * auVar108._20_4_ * 3.0;
    auVar114._24_4_ = fVar149 * auVar108._24_4_ * 3.0;
    auVar114._28_4_ = auVar110._28_4_;
    fVar167 = auVar109._0_4_ * 3.0 * fVar149;
    fVar184 = auVar109._4_4_ * 3.0 * fVar149;
    auVar115._4_4_ = fVar184;
    auVar115._0_4_ = fVar167;
    fVar186 = auVar109._8_4_ * 3.0 * fVar149;
    auVar115._8_4_ = fVar186;
    fVar188 = auVar109._12_4_ * 3.0 * fVar149;
    auVar115._12_4_ = fVar188;
    fVar190 = auVar109._16_4_ * 3.0 * fVar149;
    auVar115._16_4_ = fVar190;
    fVar192 = auVar109._20_4_ * 3.0 * fVar149;
    auVar115._20_4_ = fVar192;
    fVar194 = auVar109._24_4_ * 3.0 * fVar149;
    auVar115._24_4_ = fVar194;
    auVar115._28_4_ = fVar149;
    auVar85 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    in_ZMM26 = ZEXT1664(auVar85);
    auVar118 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_01feed00,ZEXT1632(auVar85));
    auVar119 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,ZEXT1632(auVar85));
    auVar107 = ZEXT1632(auVar85);
    auVar120 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar107);
    auVar121._0_4_ = auVar105._0_4_ + fVar167;
    auVar121._4_4_ = auVar105._4_4_ + fVar184;
    auVar121._8_4_ = auVar105._8_4_ + fVar186;
    auVar121._12_4_ = auVar105._12_4_ + fVar188;
    auVar121._16_4_ = auVar105._16_4_ + fVar190;
    auVar121._20_4_ = auVar105._20_4_ + fVar192;
    auVar121._24_4_ = auVar105._24_4_ + fVar194;
    auVar121._28_4_ = auVar105._28_4_ + fVar149;
    auVar103 = vmaxps_avx(auVar105,auVar121);
    auVar106 = vminps_avx512vl(auVar105,auVar121);
    auVar110 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar107);
    auVar121 = vpermt2ps_avx512vl(auVar131,_DAT_01feed00,auVar107);
    auVar122 = vpermt2ps_avx512vl(auVar161,_DAT_01feed00,auVar107);
    auVar128 = ZEXT1632(auVar85);
    auVar123 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar128);
    auVar105 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,auVar128);
    auVar105 = vsubps_avx(auVar110,auVar105);
    auVar107 = vsubps_avx(auVar118,ZEXT1632(auVar84));
    auVar108 = vsubps_avx(auVar119,auVar116);
    auVar109 = vsubps_avx(auVar120,auVar117);
    auVar111 = vmulps_avx512vl(auVar108,auVar114);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar161,auVar109);
    auVar112 = vmulps_avx512vl(auVar109,auVar131);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar114,auVar107);
    auVar113 = vmulps_avx512vl(auVar107,auVar161);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar131,auVar108);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar107);
    auVar113 = vrcp14ps_avx512vl(auVar112);
    auVar115 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar104);
    auVar113 = vfmadd132ps_avx512vl(auVar115,auVar113,auVar113);
    auVar111 = vmulps_avx512vl(auVar111,auVar113);
    auVar115 = vmulps_avx512vl(auVar108,auVar123);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar122,auVar109);
    auVar124 = vmulps_avx512vl(auVar109,auVar121);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar123,auVar107);
    auVar125 = vmulps_avx512vl(auVar107,auVar122);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar121,auVar108);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar115 = vfmadd231ps_avx512vl(auVar124,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar115,auVar113);
    auVar111 = vmaxps_avx512vl(auVar111,auVar113);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar113 = vmaxps_avx512vl(auVar105,auVar110);
    auVar103 = vmaxps_avx512vl(auVar103,auVar113);
    auVar113 = vaddps_avx512vl(auVar111,auVar103);
    auVar103 = vminps_avx(auVar105,auVar110);
    auVar103 = vminps_avx512vl(auVar106,auVar103);
    auVar103 = vsubps_avx512vl(auVar103,auVar111);
    auVar106._8_4_ = 0x3f800002;
    auVar106._0_8_ = 0x3f8000023f800002;
    auVar106._12_4_ = 0x3f800002;
    auVar106._16_4_ = 0x3f800002;
    auVar106._20_4_ = 0x3f800002;
    auVar106._24_4_ = 0x3f800002;
    auVar106._28_4_ = 0x3f800002;
    auVar105 = vmulps_avx512vl(auVar113,auVar106);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    local_880 = vmulps_avx512vl(auVar103,auVar110);
    auVar103 = vmulps_avx512vl(auVar105,auVar105);
    auVar105 = vrsqrt14ps_avx512vl(auVar112);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar106 = vmulps_avx512vl(auVar112,auVar111);
    fVar167 = auVar105._0_4_;
    fVar184 = auVar105._4_4_;
    fVar186 = auVar105._8_4_;
    fVar188 = auVar105._12_4_;
    fVar149 = auVar105._16_4_;
    fVar190 = auVar105._20_4_;
    fVar192 = auVar105._24_4_;
    auVar124._4_4_ = fVar184 * fVar184 * fVar184 * auVar106._4_4_;
    auVar124._0_4_ = fVar167 * fVar167 * fVar167 * auVar106._0_4_;
    auVar124._8_4_ = fVar186 * fVar186 * fVar186 * auVar106._8_4_;
    auVar124._12_4_ = fVar188 * fVar188 * fVar188 * auVar106._12_4_;
    auVar124._16_4_ = fVar149 * fVar149 * fVar149 * auVar106._16_4_;
    auVar124._20_4_ = fVar190 * fVar190 * fVar190 * auVar106._20_4_;
    auVar124._24_4_ = fVar192 * fVar192 * fVar192 * auVar106._24_4_;
    auVar124._28_4_ = auVar113._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar105 = vfmadd231ps_avx512vl(auVar124,auVar105,auVar112);
    auVar279 = ZEXT3264(auVar105);
    auVar106 = vmulps_avx512vl(auVar107,auVar105);
    auVar110 = vmulps_avx512vl(auVar108,auVar105);
    auVar111 = vmulps_avx512vl(auVar109,auVar105);
    auVar246 = ZEXT1632(auVar84);
    auVar112 = vsubps_avx512vl(auVar128,auVar246);
    auVar115 = vsubps_avx512vl(auVar128,auVar116);
    auVar124 = vsubps_avx512vl(auVar128,auVar117);
    auVar113 = vmulps_avx512vl(local_540,auVar124);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_520,auVar115);
    auVar113 = vfmadd231ps_avx512vl(auVar113,_local_500,auVar112);
    auVar125 = vmulps_avx512vl(auVar124,auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar115,auVar115);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar112,auVar112);
    auVar126 = vmulps_avx512vl(local_540,auVar111);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar110,local_520);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar106,_local_500);
    auVar111 = vmulps_avx512vl(auVar124,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar110);
    auVar106 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar106);
    auVar110 = vmulps_avx512vl(auVar126,auVar126);
    auVar111 = vsubps_avx512vl(local_220,auVar110);
    auVar127 = vmulps_avx512vl(auVar126,auVar106);
    auVar113 = vsubps_avx512vl(auVar113,auVar127);
    auVar127 = vaddps_avx512vl(auVar113,auVar113);
    auVar113 = vmulps_avx512vl(auVar106,auVar106);
    local_780 = vsubps_avx512vl(auVar125,auVar113);
    auVar103 = vsubps_avx512vl(local_780,auVar103);
    local_560 = vmulps_avx512vl(auVar127,auVar127);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar111,auVar113);
    auVar113 = vmulps_avx512vl(_local_580,auVar103);
    auVar113 = vsubps_avx512vl(local_560,auVar113);
    uVar76 = vcmpps_avx512vl(auVar113,auVar128,5);
    bVar63 = (byte)uVar76;
    fVar167 = (float)local_7c0._0_4_;
    fVar184 = (float)local_7c0._4_4_;
    fVar186 = fStack_7b8;
    fVar188 = fStack_7b4;
    fVar149 = fStack_7b0;
    fVar190 = fStack_7ac;
    fVar192 = fStack_7a8;
    fVar194 = fStack_7a4;
    if (bVar63 == 0) {
LAB_01bdda87:
      auVar268 = ZEXT3264(local_620);
      auVar249 = ZEXT3264(local_7e0);
      auVar278 = ZEXT3264(local_8a0);
      auVar280 = ZEXT3264(local_8c0);
      auVar281 = ZEXT3264(local_8e0);
    }
    else {
      auVar113 = vsqrtps_avx512vl(auVar113);
      auVar128 = vaddps_avx512vl(auVar111,auVar111);
      local_7a0 = vrcp14ps_avx512vl(auVar128);
      auVar104 = vfnmadd213ps_avx512vl(local_7a0,auVar128,auVar104);
      auVar125 = vfmadd132ps_avx512vl(auVar104,local_7a0,local_7a0);
      auVar104._8_4_ = 0x80000000;
      auVar104._0_8_ = 0x8000000080000000;
      auVar104._12_4_ = 0x80000000;
      auVar104._16_4_ = 0x80000000;
      auVar104._20_4_ = 0x80000000;
      auVar104._24_4_ = 0x80000000;
      auVar104._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar127,auVar104);
      auVar104 = vsubps_avx512vl(local_5a0,auVar113);
      local_820 = vmulps_avx512vl(auVar104,auVar125);
      auVar113 = vsubps_avx512vl(auVar113,auVar127);
      local_5c0 = vmulps_avx512vl(auVar113,auVar125);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104 = vblendmps_avx512vl(auVar113,local_820);
      auVar129._0_4_ =
           (uint)(bVar63 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar113._0_4_;
      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar113._4_4_;
      bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar113._8_4_;
      bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar113._12_4_;
      bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar129._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar113._16_4_;
      bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar129._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar113._20_4_;
      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar129._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar113._24_4_;
      bVar16 = SUB81(uVar76 >> 7,0);
      auVar129._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar113,local_5c0);
      auVar130._0_4_ =
           (uint)(bVar63 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar113._0_4_;
      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar113._4_4_;
      bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar113._8_4_;
      bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar113._12_4_;
      bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar130._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar113._16_4_;
      bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar130._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar113._20_4_;
      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar130._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar113._24_4_;
      bVar16 = SUB81(uVar76 >> 7,0);
      auVar130._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar113);
      local_5e0 = vmaxps_avx512vl(local_240,auVar113);
      in_ZMM26 = ZEXT3264(local_5e0);
      auVar125._8_4_ = 0x36000000;
      auVar125._0_8_ = 0x3600000036000000;
      auVar125._12_4_ = 0x36000000;
      auVar125._16_4_ = 0x36000000;
      auVar125._20_4_ = 0x36000000;
      auVar125._24_4_ = 0x36000000;
      auVar125._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar125);
      vandps_avx512vl(auVar111,auVar113);
      uVar66 = vcmpps_avx512vl(local_600,local_600,1);
      uVar76 = uVar76 & uVar66;
      bVar68 = (byte)uVar76;
      if (bVar68 != 0) {
        uVar66 = vcmpps_avx512vl(auVar103,_DAT_01faff00,2);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar111 = vblendmps_avx512vl(auVar103,auVar110);
        bVar67 = (byte)uVar66;
        uVar78 = (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * local_600._0_4_;
        bVar16 = (bool)((byte)(uVar66 >> 1) & 1);
        uVar77 = (uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * local_600._4_4_;
        bVar16 = (bool)((byte)(uVar66 >> 2) & 1);
        uVar141 = (uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * local_600._8_4_;
        bVar16 = (bool)((byte)(uVar66 >> 3) & 1);
        uVar142 = (uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * local_600._12_4_;
        bVar16 = (bool)((byte)(uVar66 >> 4) & 1);
        uVar143 = (uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * local_600._16_4_;
        bVar16 = (bool)((byte)(uVar66 >> 5) & 1);
        uVar144 = (uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * local_600._20_4_;
        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
        uVar145 = (uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * local_600._24_4_;
        bVar16 = SUB81(uVar66 >> 7,0);
        uVar146 = (uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * local_600._28_4_;
        auVar129._0_4_ = (bVar68 & 1) * uVar78 | !(bool)(bVar68 & 1) * auVar129._0_4_;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar129._4_4_ = bVar16 * uVar77 | !bVar16 * auVar129._4_4_;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar129._8_4_ = bVar16 * uVar141 | !bVar16 * auVar129._8_4_;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar129._12_4_ = bVar16 * uVar142 | !bVar16 * auVar129._12_4_;
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar129._16_4_ = bVar16 * uVar143 | !bVar16 * auVar129._16_4_;
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar129._20_4_ = bVar16 * uVar144 | !bVar16 * auVar129._20_4_;
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar129._24_4_ = bVar16 * uVar145 | !bVar16 * auVar129._24_4_;
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar129._28_4_ = bVar16 * uVar146 | !bVar16 * auVar129._28_4_;
        auVar103 = vblendmps_avx512vl(auVar110,auVar103);
        bVar16 = (bool)((byte)(uVar66 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar66 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar66 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar66 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar66 >> 5) & 1);
        bVar22 = (bool)((byte)(uVar66 >> 6) & 1);
        bVar23 = SUB81(uVar66 >> 7,0);
        auVar130._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar67 & 1) * auVar103._0_4_ | !(bool)(bVar67 & 1) * uVar78) |
             !(bool)(bVar68 & 1) * auVar130._0_4_;
        bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar130._4_4_ =
             (uint)bVar17 * ((uint)bVar16 * auVar103._4_4_ | !bVar16 * uVar77) |
             !bVar17 * auVar130._4_4_;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar130._8_4_ =
             (uint)bVar16 * ((uint)bVar18 * auVar103._8_4_ | !bVar18 * uVar141) |
             !bVar16 * auVar130._8_4_;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar130._12_4_ =
             (uint)bVar16 * ((uint)bVar19 * auVar103._12_4_ | !bVar19 * uVar142) |
             !bVar16 * auVar130._12_4_;
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar130._16_4_ =
             (uint)bVar16 * ((uint)bVar20 * auVar103._16_4_ | !bVar20 * uVar143) |
             !bVar16 * auVar130._16_4_;
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar130._20_4_ =
             (uint)bVar16 * ((uint)bVar21 * auVar103._20_4_ | !bVar21 * uVar144) |
             !bVar16 * auVar130._20_4_;
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar130._24_4_ =
             (uint)bVar16 * ((uint)bVar22 * auVar103._24_4_ | !bVar22 * uVar145) |
             !bVar16 * auVar130._24_4_;
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar130._28_4_ =
             (uint)bVar16 * ((uint)bVar23 * auVar103._28_4_ | !bVar23 * uVar146) |
             !bVar16 * auVar130._28_4_;
        bVar63 = (~bVar68 | bVar67) & bVar63;
      }
      if ((bVar63 & 0x7f) == 0) goto LAB_01bdda87;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM26 = ZEXT3264(auVar103);
      auVar110 = vxorps_avx512vl(auVar123,auVar103);
      auVar111 = vxorps_avx512vl(auVar121,auVar103);
      uVar78 = *(uint *)(ray + k * 4 + 0x100);
      auVar113 = vxorps_avx512vl(auVar122,auVar103);
      auVar85 = vsubss_avx512f(ZEXT416(uVar78),ZEXT416((uint)local_730._0_4_));
      auVar104 = vbroadcastss_avx512vl(auVar85);
      auVar104 = vminps_avx512vl(auVar104,auVar130);
      auVar123._4_4_ = fStack_25c;
      auVar123._0_4_ = local_260;
      auVar123._8_4_ = fStack_258;
      auVar123._12_4_ = fStack_254;
      auVar123._16_4_ = fStack_250;
      auVar123._20_4_ = fStack_24c;
      auVar123._24_4_ = fStack_248;
      auVar123._28_4_ = fStack_244;
      auVar121 = vmaxps_avx512vl(auVar123,auVar129);
      auVar124 = vmulps_avx512vl(auVar124,auVar114);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar161,auVar124);
      auVar85 = vfmadd213ps_fma(auVar112,auVar131,auVar115);
      auVar112 = vmulps_avx512vl(local_540,auVar114);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_520,auVar161);
      auVar86 = vfmadd231ps_fma(auVar112,_local_500,auVar131);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar86),auVar112);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar27 = vcmpps_avx512vl(auVar112,auVar114,1);
      auVar115 = vxorps_avx512vl(ZEXT1632(auVar85),auVar103);
      auVar124 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
      auVar161 = ZEXT1632(auVar86);
      auVar123 = vxorps_avx512vl(auVar161,auVar103);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar124,auVar161,auVar125);
      auVar85 = vfmadd132ps_fma(auVar122,auVar124,auVar124);
      fVar168 = auVar85._0_4_ * auVar115._0_4_;
      fVar185 = auVar85._4_4_ * auVar115._4_4_;
      auVar122._4_4_ = fVar185;
      auVar122._0_4_ = fVar168;
      fVar187 = auVar85._8_4_ * auVar115._8_4_;
      auVar122._8_4_ = fVar187;
      fVar189 = auVar85._12_4_ * auVar115._12_4_;
      auVar122._12_4_ = fVar189;
      fVar191 = auVar115._16_4_ * 0.0;
      auVar122._16_4_ = fVar191;
      fVar193 = auVar115._20_4_ * 0.0;
      auVar122._20_4_ = fVar193;
      fVar195 = auVar115._24_4_ * 0.0;
      auVar122._24_4_ = fVar195;
      auVar122._28_4_ = auVar115._28_4_;
      uVar28 = vcmpps_avx512vl(auVar161,auVar123,1);
      bVar68 = (byte)uVar27 | (byte)uVar28;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar122,auVar131);
      auVar132._0_4_ =
           (uint)(bVar68 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar124._0_4_;
      bVar16 = (bool)(bVar68 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar124._4_4_;
      bVar16 = (bool)(bVar68 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar124._8_4_;
      bVar16 = (bool)(bVar68 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar124._12_4_;
      bVar16 = (bool)(bVar68 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar124._16_4_;
      bVar16 = (bool)(bVar68 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar124._20_4_;
      bVar16 = (bool)(bVar68 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar124._24_4_;
      auVar132._28_4_ =
           (uint)(bVar68 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar124._28_4_;
      auVar124 = vmaxps_avx512vl(auVar121,auVar132);
      uVar28 = vcmpps_avx512vl(auVar161,auVar123,6);
      bVar68 = (byte)uVar27 | (byte)uVar28;
      auVar133._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar168;
      bVar16 = (bool)(bVar68 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar185;
      bVar16 = (bool)(bVar68 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar187;
      bVar16 = (bool)(bVar68 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar189;
      bVar16 = (bool)(bVar68 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar191;
      bVar16 = (bool)(bVar68 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar193;
      bVar16 = (bool)(bVar68 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar195;
      auVar133._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar115._28_4_;
      auVar115 = vminps_avx512vl(auVar104,auVar133);
      auVar85 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar85),auVar118);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar85),auVar119);
      auVar121 = ZEXT1632(auVar85);
      auVar120 = vsubps_avx512vl(auVar121,auVar120);
      auVar120 = vmulps_avx512vl(auVar120,auVar110);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar113,auVar119);
      auVar118 = vfmadd231ps_avx512vl(auVar119,auVar111,auVar118);
      auVar110 = vmulps_avx512vl(local_540,auVar110);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_520,auVar113);
      auVar110 = vfmadd231ps_avx512vl(auVar110,_local_500,auVar111);
      vandps_avx512vl(auVar110,auVar112);
      uVar27 = vcmpps_avx512vl(auVar110,auVar114,1);
      auVar111 = vxorps_avx512vl(auVar118,auVar103);
      auVar112 = vrcp14ps_avx512vl(auVar110);
      auVar103 = vxorps_avx512vl(auVar110,auVar103);
      auVar113 = vfnmadd213ps_avx512vl(auVar112,auVar110,auVar125);
      auVar85 = vfmadd132ps_fma(auVar113,auVar112,auVar112);
      fVar168 = auVar85._0_4_ * auVar111._0_4_;
      fVar185 = auVar85._4_4_ * auVar111._4_4_;
      auVar120._4_4_ = fVar185;
      auVar120._0_4_ = fVar168;
      fVar187 = auVar85._8_4_ * auVar111._8_4_;
      auVar120._8_4_ = fVar187;
      fVar189 = auVar85._12_4_ * auVar111._12_4_;
      auVar120._12_4_ = fVar189;
      fVar191 = auVar111._16_4_ * 0.0;
      auVar120._16_4_ = fVar191;
      fVar193 = auVar111._20_4_ * 0.0;
      auVar120._20_4_ = fVar193;
      fVar195 = auVar111._24_4_ * 0.0;
      auVar120._24_4_ = fVar195;
      auVar120._28_4_ = auVar111._28_4_;
      uVar28 = vcmpps_avx512vl(auVar110,auVar103,1);
      bVar68 = (byte)uVar27 | (byte)uVar28;
      auVar113 = vblendmps_avx512vl(auVar120,auVar131);
      auVar134._0_4_ =
           (uint)(bVar68 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar112._0_4_;
      bVar16 = (bool)(bVar68 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar112._4_4_;
      bVar16 = (bool)(bVar68 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar112._8_4_;
      bVar16 = (bool)(bVar68 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar112._12_4_;
      bVar16 = (bool)(bVar68 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar16 * auVar113._16_4_ | (uint)!bVar16 * auVar112._16_4_;
      bVar16 = (bool)(bVar68 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar16 * auVar113._20_4_ | (uint)!bVar16 * auVar112._20_4_;
      bVar16 = (bool)(bVar68 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar16 * auVar113._24_4_ | (uint)!bVar16 * auVar112._24_4_;
      auVar134._28_4_ =
           (uint)(bVar68 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar112._28_4_;
      _local_6c0 = vmaxps_avx(auVar124,auVar134);
      uVar28 = vcmpps_avx512vl(auVar110,auVar103,6);
      bVar68 = (byte)uVar27 | (byte)uVar28;
      auVar135._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar168;
      bVar16 = (bool)(bVar68 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar185;
      bVar16 = (bool)(bVar68 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar187;
      bVar16 = (bool)(bVar68 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar189;
      bVar16 = (bool)(bVar68 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar191;
      bVar16 = (bool)(bVar68 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar193;
      bVar16 = (bool)(bVar68 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar195;
      auVar135._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar111._28_4_;
      local_2c0 = vminps_avx(auVar115,auVar135);
      uVar27 = vcmpps_avx512vl(_local_6c0,local_2c0,2);
      bVar63 = bVar63 & 0x7f & (byte)uVar27;
      if (bVar63 == 0) {
        auVar282 = ZEXT3264(local_840);
        goto LAB_01bdda87;
      }
      auVar110 = vmaxps_avx512vl(auVar121,local_880);
      auVar103 = vfmadd213ps_avx512vl(local_820,auVar126,auVar106);
      fVar168 = auVar105._0_4_;
      fVar185 = auVar105._4_4_;
      auVar47._4_4_ = fVar185 * auVar103._4_4_;
      auVar47._0_4_ = fVar168 * auVar103._0_4_;
      fVar187 = auVar105._8_4_;
      auVar47._8_4_ = fVar187 * auVar103._8_4_;
      fVar189 = auVar105._12_4_;
      auVar47._12_4_ = fVar189 * auVar103._12_4_;
      fVar191 = auVar105._16_4_;
      auVar47._16_4_ = fVar191 * auVar103._16_4_;
      fVar193 = auVar105._20_4_;
      auVar47._20_4_ = fVar193 * auVar103._20_4_;
      fVar195 = auVar105._24_4_;
      auVar47._24_4_ = fVar195 * auVar103._24_4_;
      auVar47._28_4_ = auVar103._28_4_;
      auVar103 = vfmadd213ps_avx512vl(local_5c0,auVar126,auVar106);
      auVar48._4_4_ = fVar185 * auVar103._4_4_;
      auVar48._0_4_ = fVar168 * auVar103._0_4_;
      auVar48._8_4_ = fVar187 * auVar103._8_4_;
      auVar48._12_4_ = fVar189 * auVar103._12_4_;
      auVar48._16_4_ = fVar191 * auVar103._16_4_;
      auVar48._20_4_ = fVar193 * auVar103._20_4_;
      auVar48._24_4_ = fVar195 * auVar103._24_4_;
      auVar48._28_4_ = auVar134._28_4_;
      auVar103 = vminps_avx512vl(auVar47,auVar125);
      auVar56 = ZEXT812(0);
      auVar111 = ZEXT1232(auVar56) << 0x20;
      auVar103 = vmaxps_avx(auVar103,ZEXT1232(auVar56) << 0x20);
      auVar112 = vminps_avx512vl(auVar48,auVar125);
      auVar49._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar103._28_4_ + 7.0;
      auVar85 = vfmadd213ps_fma(auVar49,auVar260,auVar236);
      local_1a0 = ZEXT1632(auVar85);
      auVar103 = vmaxps_avx(auVar112,ZEXT1232(auVar56) << 0x20);
      auVar50._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar103._28_4_ + 7.0;
      auVar85 = vfmadd213ps_fma(auVar50,auVar260,auVar236);
      local_1c0 = ZEXT1632(auVar85);
      auVar51._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar51._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar51._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar51._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar51._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar51._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar51._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar51._28_4_ = auVar110._28_4_;
      auVar103 = vsubps_avx(local_780,auVar51);
      auVar52._4_4_ = auVar103._4_4_ * (float)local_580._4_4_;
      auVar52._0_4_ = auVar103._0_4_ * (float)local_580._0_4_;
      auVar52._8_4_ = auVar103._8_4_ * fStack_578;
      auVar52._12_4_ = auVar103._12_4_ * fStack_574;
      auVar52._16_4_ = auVar103._16_4_ * fStack_570;
      auVar52._20_4_ = auVar103._20_4_ * fStack_56c;
      auVar52._24_4_ = auVar103._24_4_ * fStack_568;
      auVar52._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(local_560,auVar52);
      uVar27 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar56) << 0x20,5);
      bVar68 = (byte)uVar27;
      auVar282 = ZEXT3264(local_840);
      if (bVar68 == 0) {
        bVar68 = 0;
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar249 = ZEXT864(0) << 0x20;
        auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar112 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar275 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        auVar86 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
        uVar76 = vcmpps_avx512vl(auVar110,auVar121,5);
        auVar110 = vsqrtps_avx(auVar110);
        auVar111 = vfnmadd213ps_avx512vl(auVar128,local_7a0,auVar125);
        auVar113 = vfmadd132ps_avx512vl(auVar111,local_7a0,local_7a0);
        auVar111 = vsubps_avx(local_5a0,auVar110);
        auVar114 = vmulps_avx512vl(auVar111,auVar113);
        auVar110 = vsubps_avx512vl(auVar110,auVar127);
        auVar113 = vmulps_avx512vl(auVar110,auVar113);
        auVar110 = vfmadd213ps_avx512vl(auVar126,auVar114,auVar106);
        auVar128._4_4_ = fVar185 * auVar110._4_4_;
        auVar128._0_4_ = fVar168 * auVar110._0_4_;
        auVar128._8_4_ = fVar187 * auVar110._8_4_;
        auVar128._12_4_ = fVar189 * auVar110._12_4_;
        auVar128._16_4_ = fVar191 * auVar110._16_4_;
        auVar128._20_4_ = fVar193 * auVar110._20_4_;
        auVar128._24_4_ = fVar195 * auVar110._24_4_;
        auVar128._28_4_ = auVar112._28_4_;
        auVar53._4_4_ = (float)local_500._4_4_ * auVar114._4_4_;
        auVar53._0_4_ = (float)local_500._0_4_ * auVar114._0_4_;
        auVar53._8_4_ = fStack_4f8 * auVar114._8_4_;
        auVar53._12_4_ = fStack_4f4 * auVar114._12_4_;
        auVar53._16_4_ = fStack_4f0 * auVar114._16_4_;
        auVar53._20_4_ = fStack_4ec * auVar114._20_4_;
        auVar53._24_4_ = fStack_4e8 * auVar114._24_4_;
        auVar53._28_4_ = auVar110._28_4_;
        auVar111 = vmulps_avx512vl(local_520,auVar114);
        auVar115 = vmulps_avx512vl(local_540,auVar114);
        auVar110 = vfmadd213ps_avx512vl(auVar107,auVar128,auVar246);
        auVar110 = vsubps_avx512vl(auVar53,auVar110);
        auVar112 = vfmadd213ps_avx512vl(auVar108,auVar128,auVar116);
        auVar112 = vsubps_avx512vl(auVar111,auVar112);
        auVar85 = vfmadd213ps_fma(auVar128,auVar109,auVar117);
        auVar111 = vsubps_avx(auVar115,ZEXT1632(auVar85));
        auVar275 = auVar111._0_28_;
        auVar106 = vfmadd213ps_avx512vl(auVar126,auVar113,auVar106);
        auVar106 = vmulps_avx512vl(auVar105,auVar106);
        auVar279 = ZEXT3264(auVar106);
        auVar54._4_4_ = (float)local_500._4_4_ * auVar113._4_4_;
        auVar54._0_4_ = (float)local_500._0_4_ * auVar113._0_4_;
        auVar54._8_4_ = fStack_4f8 * auVar113._8_4_;
        auVar54._12_4_ = fStack_4f4 * auVar113._12_4_;
        auVar54._16_4_ = fStack_4f0 * auVar113._16_4_;
        auVar54._20_4_ = fStack_4ec * auVar113._20_4_;
        auVar54._24_4_ = fStack_4e8 * auVar113._24_4_;
        auVar54._28_4_ = auVar115._28_4_;
        auVar105 = vmulps_avx512vl(local_520,auVar113);
        auVar115 = vmulps_avx512vl(local_540,auVar113);
        auVar85 = vfmadd213ps_fma(auVar107,auVar106,auVar246);
        auVar111 = vsubps_avx(auVar54,ZEXT1632(auVar85));
        auVar85 = vfmadd213ps_fma(auVar108,auVar106,auVar116);
        auVar105 = vsubps_avx512vl(auVar105,ZEXT1632(auVar85));
        auVar85 = vfmadd213ps_fma(auVar109,auVar106,auVar117);
        auVar107 = vsubps_avx512vl(auVar115,ZEXT1632(auVar85));
        auVar249 = ZEXT3264(auVar107);
        auVar215._8_4_ = 0x7f800000;
        auVar215._0_8_ = 0x7f8000007f800000;
        auVar215._12_4_ = 0x7f800000;
        auVar215._16_4_ = 0x7f800000;
        auVar215._20_4_ = 0x7f800000;
        auVar215._24_4_ = 0x7f800000;
        auVar215._28_4_ = 0x7f800000;
        auVar107 = vblendmps_avx512vl(auVar215,auVar114);
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar126._0_4_ = (uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar84._0_4_;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar84._4_4_;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar84._8_4_;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar84._12_4_;
        iVar1 = (uint)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_;
        auVar126._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_;
        auVar126._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_;
        auVar126._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar76 >> 7) * auVar107._28_4_;
        auVar126._28_4_ = iVar4;
        auVar216._8_4_ = 0xff800000;
        auVar216._0_8_ = 0xff800000ff800000;
        auVar216._12_4_ = 0xff800000;
        auVar216._16_4_ = 0xff800000;
        auVar216._20_4_ = 0xff800000;
        auVar216._24_4_ = 0xff800000;
        auVar216._28_4_ = 0xff800000;
        auVar107 = vblendmps_avx512vl(auVar216,auVar113);
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar127._0_4_ = (uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar127._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * -0x800000;
        auVar246._8_4_ = 0x36000000;
        auVar246._0_8_ = 0x3600000036000000;
        auVar246._12_4_ = 0x36000000;
        auVar246._16_4_ = 0x36000000;
        auVar246._20_4_ = 0x36000000;
        auVar246._24_4_ = 0x36000000;
        auVar246._28_4_ = 0x36000000;
        auVar107 = vmulps_avx512vl(local_5e0,auVar246);
        uVar66 = vcmpps_avx512vl(auVar107,local_600,0xe);
        uVar76 = uVar76 & uVar66;
        bVar67 = (byte)uVar76;
        if (bVar67 != 0) {
          uVar66 = vcmpps_avx512vl(auVar103,ZEXT1632(auVar86),2);
          auVar273._8_4_ = 0x7f800000;
          auVar273._0_8_ = 0x7f8000007f800000;
          auVar273._12_4_ = 0x7f800000;
          auVar273._16_4_ = 0x7f800000;
          auVar273._20_4_ = 0x7f800000;
          auVar273._24_4_ = 0x7f800000;
          auVar273._28_4_ = 0x7f800000;
          auVar276._8_4_ = 0xff800000;
          auVar276._0_8_ = 0xff800000ff800000;
          auVar276._12_4_ = 0xff800000;
          auVar276._16_4_ = 0xff800000;
          auVar276._20_4_ = 0xff800000;
          auVar276._24_4_ = 0xff800000;
          auVar276._28_4_ = 0xff800000;
          auVar103 = vblendmps_avx512vl(auVar273,auVar276);
          bVar71 = (byte)uVar66;
          uVar77 = (uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar107._0_4_;
          bVar16 = (bool)((byte)(uVar66 >> 1) & 1);
          uVar141 = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar107._4_4_;
          bVar16 = (bool)((byte)(uVar66 >> 2) & 1);
          uVar142 = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar107._8_4_;
          bVar16 = (bool)((byte)(uVar66 >> 3) & 1);
          uVar143 = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar107._12_4_;
          bVar16 = (bool)((byte)(uVar66 >> 4) & 1);
          uVar144 = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * auVar107._16_4_;
          bVar16 = (bool)((byte)(uVar66 >> 5) & 1);
          uVar145 = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * auVar107._20_4_;
          bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
          uVar146 = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * auVar107._24_4_;
          bVar16 = SUB81(uVar66 >> 7,0);
          uVar147 = (uint)bVar16 * auVar103._28_4_ | (uint)!bVar16 * auVar107._28_4_;
          auVar126._0_4_ = (bVar67 & 1) * uVar77 | !(bool)(bVar67 & 1) * auVar126._0_4_;
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar126._4_4_ = bVar16 * uVar141 | !bVar16 * auVar126._4_4_;
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar126._8_4_ = bVar16 * uVar142 | !bVar16 * auVar126._8_4_;
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar126._12_4_ = bVar16 * uVar143 | !bVar16 * auVar126._12_4_;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar126._16_4_ = bVar16 * uVar144 | (uint)!bVar16 * iVar1;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar126._20_4_ = bVar16 * uVar145 | (uint)!bVar16 * iVar2;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar126._24_4_ = bVar16 * uVar146 | (uint)!bVar16 * iVar3;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar126._28_4_ = bVar16 * uVar147 | (uint)!bVar16 * iVar4;
          auVar103 = vblendmps_avx512vl(auVar276,auVar273);
          bVar16 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar66 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar66 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar66 >> 5) & 1);
          bVar22 = (bool)((byte)(uVar66 >> 6) & 1);
          bVar23 = SUB81(uVar66 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar67 & 1) *
               ((uint)(bVar71 & 1) * auVar103._0_4_ | !(bool)(bVar71 & 1) * uVar77) |
               !(bool)(bVar67 & 1) * auVar127._0_4_;
          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar17 * ((uint)bVar16 * auVar103._4_4_ | !bVar16 * uVar141) |
               !bVar17 * auVar127._4_4_;
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar16 * ((uint)bVar18 * auVar103._8_4_ | !bVar18 * uVar142) |
               !bVar16 * auVar127._8_4_;
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar16 * ((uint)bVar19 * auVar103._12_4_ | !bVar19 * uVar143) |
               !bVar16 * auVar127._12_4_;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar16 * ((uint)bVar20 * auVar103._16_4_ | !bVar20 * uVar144) |
               !bVar16 * auVar127._16_4_;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar16 * ((uint)bVar21 * auVar103._20_4_ | !bVar21 * uVar145) |
               !bVar16 * auVar127._20_4_;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar16 * ((uint)bVar22 * auVar103._24_4_ | !bVar22 * uVar146) |
               !bVar16 * auVar127._24_4_;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar16 * ((uint)bVar23 * auVar103._28_4_ | !bVar23 * uVar147) |
               !bVar16 * auVar127._28_4_;
          bVar68 = (~bVar67 | bVar71) & bVar68;
        }
      }
      auVar268._0_4_ = local_540._0_4_ * auVar249._0_4_;
      auVar268._4_4_ = local_540._4_4_ * auVar249._4_4_;
      auVar268._8_4_ = local_540._8_4_ * auVar249._8_4_;
      auVar268._12_4_ = local_540._12_4_ * auVar249._12_4_;
      auVar268._16_4_ = local_540._16_4_ * auVar249._16_4_;
      auVar268._20_4_ = local_540._20_4_ * auVar249._20_4_;
      auVar268._28_36_ = auVar249._28_36_;
      auVar268._24_4_ = local_540._24_4_ * auVar249._24_4_;
      auVar85 = vfmadd231ps_fma(auVar268._0_32_,local_520,auVar105);
      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),_local_500,auVar111);
      _local_200 = _local_6c0;
      local_1e0 = vminps_avx(local_2c0,auVar126);
      auVar267._8_4_ = 0x7fffffff;
      auVar267._0_8_ = 0x7fffffff7fffffff;
      auVar267._12_4_ = 0x7fffffff;
      auVar267._16_4_ = 0x7fffffff;
      auVar267._20_4_ = 0x7fffffff;
      auVar267._24_4_ = 0x7fffffff;
      auVar267._28_4_ = 0x7fffffff;
      auVar103 = vandps_avx(ZEXT1632(auVar85),auVar267);
      auVar105 = vmaxps_avx(_local_6c0,auVar127);
      local_2e0 = auVar105;
      auVar218._8_4_ = 0x3e99999a;
      auVar218._0_8_ = 0x3e99999a3e99999a;
      auVar218._12_4_ = 0x3e99999a;
      auVar218._16_4_ = 0x3e99999a;
      auVar218._20_4_ = 0x3e99999a;
      auVar218._24_4_ = 0x3e99999a;
      auVar218._28_4_ = 0x3e99999a;
      uVar27 = vcmpps_avx512vl(auVar103,auVar218,1);
      local_4e0._0_2_ = (short)uVar27;
      uVar27 = vcmpps_avx512vl(_local_6c0,local_1e0,2);
      bVar67 = (byte)uVar27 & bVar63;
      uVar28 = vcmpps_avx512vl(auVar105,local_2c0,2);
      auVar278 = ZEXT3264(local_8a0);
      auVar280 = ZEXT3264(local_8c0);
      auVar281 = ZEXT3264(local_8e0);
      if ((bVar63 & ((byte)uVar28 | (byte)uVar27)) == 0) {
        auVar268 = ZEXT3264(local_620);
        auVar249 = ZEXT3264(local_7e0);
      }
      else {
        auVar55._4_4_ = local_540._4_4_ * auVar275._4_4_;
        auVar55._0_4_ = local_540._0_4_ * auVar275._0_4_;
        auVar55._8_4_ = local_540._8_4_ * auVar275._8_4_;
        auVar55._12_4_ = local_540._12_4_ * auVar275._12_4_;
        auVar55._16_4_ = local_540._16_4_ * auVar275._16_4_;
        auVar55._20_4_ = local_540._20_4_ * auVar275._20_4_;
        auVar55._24_4_ = local_540._24_4_ * auVar275._24_4_;
        auVar55._28_4_ = 0x3e99999a;
        auVar85 = vfmadd213ps_fma(auVar112,local_520,auVar55);
        auVar85 = vfmadd213ps_fma(auVar110,_local_500,ZEXT1632(auVar85));
        auVar103 = vandps_avx(ZEXT1632(auVar85),auVar267);
        uVar27 = vcmpps_avx512vl(auVar103,auVar218,1);
        bVar71 = (byte)uVar27 | ~bVar68;
        auVar163._8_4_ = 2;
        auVar163._0_8_ = 0x200000002;
        auVar163._12_4_ = 2;
        auVar163._16_4_ = 2;
        auVar163._20_4_ = 2;
        auVar163._24_4_ = 2;
        auVar163._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar163,auVar44);
        local_280._0_4_ = (uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar16 = (bool)(bVar71 >> 1 & 1);
        local_280._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar71 >> 2 & 1);
        local_280._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar71 >> 3 & 1);
        local_280._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar71 >> 4 & 1);
        local_280._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar71 >> 5 & 1);
        local_280._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar71 >> 6 & 1);
        local_280._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 2;
        local_280._28_4_ = (uint)(bVar71 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        local_460 = vpbroadcastd_avx512vl();
        uVar27 = vpcmpd_avx512vl(local_460,local_280,5);
        bVar71 = (byte)uVar27 & bVar67;
        if (bVar71 == 0) {
          auVar165._4_4_ = uVar78;
          auVar165._0_4_ = uVar78;
          auVar165._8_4_ = uVar78;
          auVar165._12_4_ = uVar78;
          auVar165._16_4_ = uVar78;
          auVar165._20_4_ = uVar78;
          auVar165._24_4_ = uVar78;
          auVar165._28_4_ = uVar78;
        }
        else {
          local_2a0 = auVar105;
          auVar86 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar85 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar24 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar87 = vminps_avx(auVar86,auVar24);
          auVar86 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar24 = vmaxps_avx(auVar85,auVar86);
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar87,auVar199);
          auVar86 = vandps_avx(auVar24,auVar199);
          auVar85 = vmaxps_avx(auVar85,auVar86);
          auVar86 = vmovshdup_avx(auVar85);
          auVar86 = vmaxss_avx(auVar86,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar86);
          fVar167 = auVar85._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar24,auVar24,0xff);
          local_4c0 = (float)local_7c0._0_4_ + (float)local_6c0._0_4_;
          fStack_4bc = (float)local_7c0._4_4_ + (float)local_6c0._4_4_;
          fStack_4b8 = fStack_7b8 + fStack_6b8;
          fStack_4b4 = fStack_7b4 + fStack_6b4;
          fStack_4b0 = fStack_7b0 + fStack_6b0;
          fStack_4ac = fStack_7ac + fStack_6ac;
          fStack_4a8 = fStack_7a8 + fStack_6a8;
          fStack_4a4 = fStack_7a4 + fStack_6a4;
          do {
            auVar164._8_4_ = 0x7f800000;
            auVar164._0_8_ = 0x7f8000007f800000;
            auVar164._12_4_ = 0x7f800000;
            auVar164._16_4_ = 0x7f800000;
            auVar164._20_4_ = 0x7f800000;
            auVar164._24_4_ = 0x7f800000;
            auVar164._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar164,_local_6c0);
            auVar137._0_4_ =
                 (uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
            bVar16 = (bool)(bVar71 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar71 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar71 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar71 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar71 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar71 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar103 = vminps_avx(auVar137,auVar103);
            auVar105 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar105);
            auVar105 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar105);
            uVar27 = vcmpps_avx512vl(auVar137,auVar103,0);
            bVar64 = (byte)uVar27 & bVar71;
            bVar65 = bVar71;
            if (bVar64 != 0) {
              bVar65 = bVar64;
            }
            iVar2 = 0;
            for (uVar78 = (uint)bVar65; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar78 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
            fVar184 = auVar82._0_4_;
            auVar85 = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              fVar184 = sqrtf((float)local_800._0_4_);
              auVar85 = local_880._0_16_;
            }
            auVar85 = vinsertps_avx(auVar85,ZEXT416(uVar78),0x10);
            lVar73 = 5;
            do {
              uVar169 = auVar85._0_4_;
              auVar154._4_4_ = uVar169;
              auVar154._0_4_ = uVar169;
              auVar154._8_4_ = uVar169;
              auVar154._12_4_ = uVar169;
              auVar24 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_7f0);
              auVar86 = vmovshdup_avx(auVar85);
              local_5a0._0_16_ = auVar86;
              fVar192 = 1.0 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar85,auVar85,0x55);
              fVar186 = auVar86._0_4_;
              auVar200._0_4_ = local_680._0_4_ * fVar186;
              fVar188 = auVar86._4_4_;
              auVar200._4_4_ = local_680._4_4_ * fVar188;
              fVar149 = auVar86._8_4_;
              auVar200._8_4_ = local_680._8_4_ * fVar149;
              fVar190 = auVar86._12_4_;
              auVar200._12_4_ = local_680._12_4_ * fVar190;
              _local_580 = ZEXT416((uint)fVar192);
              auVar224._4_4_ = fVar192;
              auVar224._0_4_ = fVar192;
              auVar224._8_4_ = fVar192;
              auVar224._12_4_ = fVar192;
              auVar86 = vfmadd231ps_fma(auVar200,auVar224,local_640._0_16_);
              auVar242._0_4_ = local_660._0_4_ * fVar186;
              auVar242._4_4_ = local_660._4_4_ * fVar188;
              auVar242._8_4_ = local_660._8_4_ * fVar149;
              auVar242._12_4_ = local_660._12_4_ * fVar190;
              auVar87 = vfmadd231ps_fma(auVar242,auVar224,local_680._0_16_);
              auVar256._0_4_ = fVar186 * (float)local_6a0._0_4_;
              auVar256._4_4_ = fVar188 * (float)local_6a0._4_4_;
              auVar256._8_4_ = fVar149 * fStack_698;
              auVar256._12_4_ = fVar190 * fStack_694;
              auVar88 = vfmadd231ps_fma(auVar256,auVar224,local_660._0_16_);
              auVar265._0_4_ = fVar186 * auVar87._0_4_;
              auVar265._4_4_ = fVar188 * auVar87._4_4_;
              auVar265._8_4_ = fVar149 * auVar87._8_4_;
              auVar265._12_4_ = fVar190 * auVar87._12_4_;
              auVar86 = vfmadd231ps_fma(auVar265,auVar224,auVar86);
              auVar201._0_4_ = fVar186 * auVar88._0_4_;
              auVar201._4_4_ = fVar188 * auVar88._4_4_;
              auVar201._8_4_ = fVar149 * auVar88._8_4_;
              auVar201._12_4_ = fVar190 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar201,auVar224,auVar87);
              auVar243._0_4_ = fVar186 * auVar87._0_4_;
              auVar243._4_4_ = fVar188 * auVar87._4_4_;
              auVar243._8_4_ = fVar149 * auVar87._8_4_;
              auVar243._12_4_ = fVar190 * auVar87._12_4_;
              auVar88 = vfmadd231ps_fma(auVar243,auVar86,auVar224);
              auVar86 = vsubps_avx(auVar87,auVar86);
              auVar33._8_4_ = 0x40400000;
              auVar33._0_8_ = 0x4040000040400000;
              auVar33._12_4_ = 0x40400000;
              auVar87 = vmulps_avx512vl(auVar86,auVar33);
              local_560._0_16_ = auVar88;
              auVar24 = vsubps_avx(auVar24,auVar88);
              auVar86 = vdpps_avx(auVar24,auVar24,0x7f);
              local_880._0_16_ = auVar86;
              local_780 = ZEXT1632(auVar85);
              if (auVar86._0_4_ < 0.0) {
                auVar249._0_4_ = sqrtf(auVar86._0_4_);
                auVar249._4_60_ = extraout_var;
                auVar85 = auVar249._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar86,auVar86);
              }
              local_5c0._0_16_ = vdpps_avx(auVar87,auVar87,0x7f);
              fVar186 = local_5c0._0_4_;
              auVar202._4_12_ = ZEXT812(0) << 0x20;
              auVar202._0_4_ = fVar186;
              local_820._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar202);
              fVar188 = local_820._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar202);
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_5c0._0_16_,auVar34);
              auVar86 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar86._0_4_;
              local_7a0._0_4_ = auVar85._0_4_;
              if (fVar186 < auVar88._0_4_) {
                fVar149 = sqrtf(fVar186);
                auVar85 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar86 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar149 = auVar86._0_4_;
              }
              fVar190 = local_820._0_4_;
              fVar186 = fVar188 * 1.5 + fVar186 * -0.5 * fVar190 * fVar190 * fVar190;
              auVar155._0_4_ = auVar87._0_4_ * fVar186;
              auVar155._4_4_ = auVar87._4_4_ * fVar186;
              auVar155._8_4_ = auVar87._8_4_ * fVar186;
              auVar155._12_4_ = auVar87._12_4_ * fVar186;
              local_820._0_16_ = vdpps_avx(auVar24,auVar155,0x7f);
              auVar84 = vaddss_avx512f(auVar85,ZEXT416(0x3f800000));
              auVar156._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar156._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar156._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar156._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar86 = vsubps_avx(local_880._0_16_,auVar156);
              fVar188 = auVar86._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar188;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              in_ZMM26 = ZEXT1664(auVar89);
              auVar90 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              uVar75 = fVar188 == 0.0;
              uVar74 = fVar188 < 0.0;
              if ((bool)uVar74) {
                local_6e0._0_4_ = fVar149;
                local_700._0_4_ = auVar89._0_4_;
                local_710._4_4_ = fVar186;
                local_710._0_4_ = fVar186;
                fStack_708 = fVar186;
                fStack_704 = fVar186;
                local_6f0 = auVar88;
                fVar188 = sqrtf(fVar188);
                auVar90 = ZEXT416(auVar90._0_4_);
                in_ZMM26 = ZEXT464((uint)local_700._0_4_);
                auVar85 = ZEXT416((uint)local_7a0._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar88 = local_6f0;
                fVar186 = (float)local_710._0_4_;
                fVar190 = (float)local_710._4_4_;
                fVar192 = fStack_708;
                fVar194 = fStack_704;
                fVar149 = (float)local_6e0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar188 = auVar86._0_4_;
                fVar190 = fVar186;
                fVar192 = fVar186;
                fVar194 = fVar186;
              }
              auVar282 = ZEXT3264(local_840);
              auVar278 = ZEXT3264(local_8a0);
              auVar280 = ZEXT3264(local_8c0);
              auVar281 = ZEXT3264(local_8e0);
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar168 = auVar86._0_4_ * 6.0;
              fVar185 = local_5a0._0_4_ * 6.0;
              auVar225._0_4_ = fVar185 * (float)local_6a0._0_4_;
              auVar225._4_4_ = fVar185 * (float)local_6a0._4_4_;
              auVar225._8_4_ = fVar185 * fStack_698;
              auVar225._12_4_ = fVar185 * fStack_694;
              auVar203._4_4_ = fVar168;
              auVar203._0_4_ = fVar168;
              auVar203._8_4_ = fVar168;
              auVar203._12_4_ = fVar168;
              auVar86 = vfmadd132ps_fma(auVar203,auVar225,local_660._0_16_);
              fVar168 = auVar89._0_4_ * 6.0;
              auVar175._4_4_ = fVar168;
              auVar175._0_4_ = fVar168;
              auVar175._8_4_ = fVar168;
              auVar175._12_4_ = fVar168;
              auVar86 = vfmadd132ps_fma(auVar175,auVar86,local_680._0_16_);
              fVar168 = local_580._0_4_ * 6.0;
              auVar204._4_4_ = fVar168;
              auVar204._0_4_ = fVar168;
              auVar204._8_4_ = fVar168;
              auVar204._12_4_ = fVar168;
              auVar86 = vfmadd132ps_fma(auVar204,auVar86,local_640._0_16_);
              auVar176._0_4_ = auVar86._0_4_ * (float)local_5c0._0_4_;
              auVar176._4_4_ = auVar86._4_4_ * (float)local_5c0._0_4_;
              auVar176._8_4_ = auVar86._8_4_ * (float)local_5c0._0_4_;
              auVar176._12_4_ = auVar86._12_4_ * (float)local_5c0._0_4_;
              auVar86 = vdpps_avx(auVar87,auVar86,0x7f);
              fVar168 = auVar86._0_4_;
              auVar205._0_4_ = auVar87._0_4_ * fVar168;
              auVar205._4_4_ = auVar87._4_4_ * fVar168;
              auVar205._8_4_ = auVar87._8_4_ * fVar168;
              auVar205._12_4_ = auVar87._12_4_ * fVar168;
              auVar86 = vsubps_avx(auVar176,auVar205);
              fVar168 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar167),
                                   ZEXT416((uint)(local_780._0_4_ * fVar184 * 1.9073486e-06)));
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(auVar87,auVar35);
              auVar206._0_4_ = fVar186 * auVar86._0_4_ * fVar168;
              auVar206._4_4_ = fVar190 * auVar86._4_4_ * fVar168;
              auVar206._8_4_ = fVar192 * auVar86._8_4_ * fVar168;
              auVar206._12_4_ = fVar194 * auVar86._12_4_ * fVar168;
              auVar279 = ZEXT1664(auVar155);
              auVar86 = vdpps_avx(auVar91,auVar155,0x7f);
              auVar92 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar167),auVar89);
              auVar85 = vdpps_avx(auVar24,auVar206,0x7f);
              vfmadd213ss_avx512f(auVar84,ZEXT416((uint)(fVar167 / fVar149)),auVar92);
              fVar186 = auVar86._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_7f0,auVar155,0x7f);
              auVar86 = vdpps_avx(auVar24,auVar91,0x7f);
              auVar84 = vmulss_avx512f(auVar90,auVar88);
              auVar88 = vmulss_avx512f(auVar88,auVar88);
              auVar90 = vaddss_avx512f(in_ZMM26._0_16_,
                                       ZEXT416((uint)(auVar84._0_4_ * auVar88._0_4_)));
              auVar88 = vdpps_avx(auVar24,local_7f0,0x7f);
              auVar92 = vfnmadd231ss_avx512f(auVar86,local_820._0_16_,ZEXT416((uint)fVar186));
              auVar88 = vfnmadd231ss_avx512f(auVar88,local_820._0_16_,auVar85);
              auVar86 = vpermilps_avx(local_560._0_16_,0xff);
              fVar188 = fVar188 - auVar86._0_4_;
              auVar84 = vshufps_avx(auVar87,auVar87,0xff);
              auVar86 = vfmsub213ss_fma(auVar92,auVar90,auVar84);
              auVar271._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar271._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar271._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * auVar90._0_4_));
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar186),auVar88);
              auVar86 = vinsertps_avx(auVar271,auVar88,0x1c);
              auVar257._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar257._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar257._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)fVar186),auVar257,0x10);
              auVar226._0_4_ = auVar90._0_4_;
              auVar226._4_4_ = auVar226._0_4_;
              auVar226._8_4_ = auVar226._0_4_;
              auVar226._12_4_ = auVar226._0_4_;
              auVar85 = vdivps_avx(auVar86,auVar226);
              auVar86 = vdivps_avx(auVar88,auVar226);
              auVar88 = vbroadcastss_avx512vl(local_820._0_16_);
              auVar227._0_4_ = auVar88._0_4_ * auVar85._0_4_ + fVar188 * auVar86._0_4_;
              auVar227._4_4_ = auVar88._4_4_ * auVar85._4_4_ + fVar188 * auVar86._4_4_;
              auVar227._8_4_ = auVar88._8_4_ * auVar85._8_4_ + fVar188 * auVar86._8_4_;
              auVar227._12_4_ = auVar88._12_4_ * auVar85._12_4_ + fVar188 * auVar86._12_4_;
              auVar85 = vsubps_avx(local_780._0_16_,auVar227);
              auVar36._8_4_ = 0x7fffffff;
              auVar36._0_8_ = 0x7fffffff7fffffff;
              auVar36._12_4_ = 0x7fffffff;
              auVar86 = vandps_avx512vl(local_820._0_16_,auVar36);
              auVar86 = vucomiss_avx512f(auVar86);
              if (!(bool)uVar74 && !(bool)uVar75) {
                auVar86 = vaddss_avx512f(auVar89,auVar86);
                auVar86 = vfmadd231ss_fma(auVar86,local_720,ZEXT416(0x36000000));
                auVar37._8_4_ = 0x7fffffff;
                auVar37._0_8_ = 0x7fffffff7fffffff;
                auVar37._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx512vl(ZEXT416((uint)fVar188),auVar37);
                if (auVar88._0_4_ < auVar86._0_4_) {
                  fVar184 = auVar85._0_4_ + (float)local_730._0_4_;
                  if ((fVar184 < fVar148) ||
                     (fVar186 = *(float *)(ray + k * 4 + 0x100), fVar186 < fVar184)) break;
                  auVar86 = vmovshdup_avx(auVar85);
                  fVar188 = auVar86._0_4_;
                  if ((fVar188 < 0.0) || (1.0 < fVar188)) break;
                  auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_880._0_4_));
                  fVar149 = auVar86._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar72].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar149 = fVar149 * 1.5 +
                            (float)local_880._0_4_ * -0.5 * fVar149 * fVar149 * fVar149;
                  auVar228._0_4_ = auVar24._0_4_ * fVar149;
                  auVar228._4_4_ = auVar24._4_4_ * fVar149;
                  auVar228._8_4_ = auVar24._8_4_ * fVar149;
                  auVar228._12_4_ = auVar24._12_4_ * fVar149;
                  auVar88 = vfmadd213ps_fma(auVar84,auVar228,auVar87);
                  auVar86 = vshufps_avx(auVar228,auVar228,0xc9);
                  auVar24 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar229._0_4_ = auVar228._0_4_ * auVar24._0_4_;
                  auVar229._4_4_ = auVar228._4_4_ * auVar24._4_4_;
                  auVar229._8_4_ = auVar228._8_4_ * auVar24._8_4_;
                  auVar229._12_4_ = auVar228._12_4_ * auVar24._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar229,auVar87,auVar86);
                  auVar86 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar24 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar157._0_4_ = auVar88._0_4_ * auVar87._0_4_;
                  auVar157._4_4_ = auVar88._4_4_ * auVar87._4_4_;
                  auVar157._8_4_ = auVar88._8_4_ * auVar87._8_4_;
                  auVar157._12_4_ = auVar88._12_4_ * auVar87._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar157,auVar86,auVar24);
                  uVar169 = auVar86._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar184;
                    uVar8 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar169;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar188;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar72;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar15 = context->user;
                  auVar237._8_4_ = 1;
                  auVar237._0_8_ = 0x100000001;
                  auVar237._12_4_ = 1;
                  auVar237._16_4_ = 1;
                  auVar237._20_4_ = 1;
                  auVar237._24_4_ = 1;
                  auVar237._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar237,ZEXT1632(auVar85));
                  auVar103 = vpermps_avx2(auVar237,ZEXT1632(auVar86));
                  auVar247._8_4_ = 2;
                  auVar247._0_8_ = 0x200000002;
                  auVar247._12_4_ = 2;
                  auVar247._16_4_ = 2;
                  auVar247._20_4_ = 2;
                  auVar247._24_4_ = 2;
                  auVar247._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar247,ZEXT1632(auVar86));
                  local_400[0] = (RTCHitN)auVar103[0];
                  local_400[1] = (RTCHitN)auVar103[1];
                  local_400[2] = (RTCHitN)auVar103[2];
                  local_400[3] = (RTCHitN)auVar103[3];
                  local_400[4] = (RTCHitN)auVar103[4];
                  local_400[5] = (RTCHitN)auVar103[5];
                  local_400[6] = (RTCHitN)auVar103[6];
                  local_400[7] = (RTCHitN)auVar103[7];
                  local_400[8] = (RTCHitN)auVar103[8];
                  local_400[9] = (RTCHitN)auVar103[9];
                  local_400[10] = (RTCHitN)auVar103[10];
                  local_400[0xb] = (RTCHitN)auVar103[0xb];
                  local_400[0xc] = (RTCHitN)auVar103[0xc];
                  local_400[0xd] = (RTCHitN)auVar103[0xd];
                  local_400[0xe] = (RTCHitN)auVar103[0xe];
                  local_400[0xf] = (RTCHitN)auVar103[0xf];
                  local_400[0x10] = (RTCHitN)auVar103[0x10];
                  local_400[0x11] = (RTCHitN)auVar103[0x11];
                  local_400[0x12] = (RTCHitN)auVar103[0x12];
                  local_400[0x13] = (RTCHitN)auVar103[0x13];
                  local_400[0x14] = (RTCHitN)auVar103[0x14];
                  local_400[0x15] = (RTCHitN)auVar103[0x15];
                  local_400[0x16] = (RTCHitN)auVar103[0x16];
                  local_400[0x17] = (RTCHitN)auVar103[0x17];
                  local_400[0x18] = (RTCHitN)auVar103[0x18];
                  local_400[0x19] = (RTCHitN)auVar103[0x19];
                  local_400[0x1a] = (RTCHitN)auVar103[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar103[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar103[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar103[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar103[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar103[0x1f];
                  local_3c0 = uVar169;
                  uStack_3bc = uVar169;
                  uStack_3b8 = uVar169;
                  uStack_3b4 = uVar169;
                  uStack_3b0 = uVar169;
                  uStack_3ac = uVar169;
                  uStack_3a8 = uVar169;
                  uStack_3a4 = uVar169;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_440._0_8_;
                  uStack_358 = local_440._8_8_;
                  uStack_350 = local_440._16_8_;
                  uStack_348 = local_440._24_8_;
                  local_340 = local_420;
                  auVar103 = vpcmpeqd_avx2(local_420,local_420);
                  local_848[1] = auVar103;
                  *local_848 = auVar103;
                  local_320 = pRVar15->instID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  local_300 = pRVar15->instPrimID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  *(float *)(ray + k * 4 + 0x100) = fVar184;
                  local_760 = local_480;
                  local_910.valid = (int *)local_760;
                  local_910.geometryUserPtr = pGVar9->userPtr;
                  local_910.context = context->user;
                  local_910.hit = local_400;
                  local_910.N = 8;
                  local_910.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar279 = ZEXT1664(auVar155);
                    (*pGVar9->intersectionFilterN)(&local_910);
                    auVar281 = ZEXT3264(local_8e0);
                    auVar280 = ZEXT3264(local_8c0);
                    auVar278 = ZEXT3264(local_8a0);
                    auVar282 = ZEXT3264(local_840);
                  }
                  if (local_760 != (undefined1  [32])0x0) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      (*p_Var14)(&local_910);
                      auVar281 = ZEXT3264(local_8e0);
                      auVar280 = ZEXT3264(local_8c0);
                      auVar278 = ZEXT3264(local_8a0);
                      auVar282 = ZEXT3264(local_840);
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      uVar76 = vptestmd_avx512vl(local_760,local_760);
                      iVar3 = *(int *)(local_910.hit + 4);
                      iVar4 = *(int *)(local_910.hit + 8);
                      iVar1 = *(int *)(local_910.hit + 0xc);
                      iVar57 = *(int *)(local_910.hit + 0x10);
                      iVar58 = *(int *)(local_910.hit + 0x14);
                      iVar59 = *(int *)(local_910.hit + 0x18);
                      iVar60 = *(int *)(local_910.hit + 0x1c);
                      bVar65 = (byte)uVar76;
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x180) =
                           (uint)(bVar65 & 1) * *(int *)local_910.hit |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_910.ray + 0x180);
                      *(uint *)(local_910.ray + 0x184) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x184);
                      *(uint *)(local_910.ray + 0x188) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x188);
                      *(uint *)(local_910.ray + 0x18c) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x18c);
                      *(uint *)(local_910.ray + 400) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 400);
                      *(uint *)(local_910.ray + 0x194) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x194);
                      *(uint *)(local_910.ray + 0x198) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x198);
                      *(uint *)(local_910.ray + 0x19c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x19c);
                      iVar3 = *(int *)(local_910.hit + 0x24);
                      iVar4 = *(int *)(local_910.hit + 0x28);
                      iVar1 = *(int *)(local_910.hit + 0x2c);
                      iVar57 = *(int *)(local_910.hit + 0x30);
                      iVar58 = *(int *)(local_910.hit + 0x34);
                      iVar59 = *(int *)(local_910.hit + 0x38);
                      iVar60 = *(int *)(local_910.hit + 0x3c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1a0) =
                           (uint)(bVar65 & 1) * *(int *)(local_910.hit + 0x20) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_910.ray + 0x1a0);
                      *(uint *)(local_910.ray + 0x1a4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1a4);
                      *(uint *)(local_910.ray + 0x1a8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1a8);
                      *(uint *)(local_910.ray + 0x1ac) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1ac);
                      *(uint *)(local_910.ray + 0x1b0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1b0);
                      *(uint *)(local_910.ray + 0x1b4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x1b4);
                      *(uint *)(local_910.ray + 0x1b8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1b8);
                      *(uint *)(local_910.ray + 0x1bc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1bc);
                      iVar3 = *(int *)(local_910.hit + 0x44);
                      iVar4 = *(int *)(local_910.hit + 0x48);
                      iVar1 = *(int *)(local_910.hit + 0x4c);
                      iVar57 = *(int *)(local_910.hit + 0x50);
                      iVar58 = *(int *)(local_910.hit + 0x54);
                      iVar59 = *(int *)(local_910.hit + 0x58);
                      iVar60 = *(int *)(local_910.hit + 0x5c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1c0) =
                           (uint)(bVar65 & 1) * *(int *)(local_910.hit + 0x40) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_910.ray + 0x1c0);
                      *(uint *)(local_910.ray + 0x1c4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1c4);
                      *(uint *)(local_910.ray + 0x1c8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1c8);
                      *(uint *)(local_910.ray + 0x1cc) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1cc);
                      *(uint *)(local_910.ray + 0x1d0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1d0);
                      *(uint *)(local_910.ray + 0x1d4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x1d4);
                      *(uint *)(local_910.ray + 0x1d8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1d8);
                      *(uint *)(local_910.ray + 0x1dc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1dc);
                      iVar3 = *(int *)(local_910.hit + 100);
                      iVar4 = *(int *)(local_910.hit + 0x68);
                      iVar1 = *(int *)(local_910.hit + 0x6c);
                      iVar57 = *(int *)(local_910.hit + 0x70);
                      iVar58 = *(int *)(local_910.hit + 0x74);
                      iVar59 = *(int *)(local_910.hit + 0x78);
                      iVar60 = *(int *)(local_910.hit + 0x7c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1e0) =
                           (uint)(bVar65 & 1) * *(int *)(local_910.hit + 0x60) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_910.ray + 0x1e0);
                      *(uint *)(local_910.ray + 0x1e4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1e4);
                      *(uint *)(local_910.ray + 0x1e8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1e8);
                      *(uint *)(local_910.ray + 0x1ec) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1ec);
                      *(uint *)(local_910.ray + 0x1f0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1f0);
                      *(uint *)(local_910.ray + 500) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 500);
                      *(uint *)(local_910.ray + 0x1f8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1f8);
                      *(uint *)(local_910.ray + 0x1fc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1fc);
                      iVar3 = *(int *)(local_910.hit + 0x84);
                      iVar4 = *(int *)(local_910.hit + 0x88);
                      iVar1 = *(int *)(local_910.hit + 0x8c);
                      iVar57 = *(int *)(local_910.hit + 0x90);
                      iVar58 = *(int *)(local_910.hit + 0x94);
                      iVar59 = *(int *)(local_910.hit + 0x98);
                      iVar60 = *(int *)(local_910.hit + 0x9c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x200) =
                           (uint)(bVar65 & 1) * *(int *)(local_910.hit + 0x80) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_910.ray + 0x200);
                      *(uint *)(local_910.ray + 0x204) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x204);
                      *(uint *)(local_910.ray + 0x208) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x208);
                      *(uint *)(local_910.ray + 0x20c) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x20c);
                      *(uint *)(local_910.ray + 0x210) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x210);
                      *(uint *)(local_910.ray + 0x214) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x214);
                      *(uint *)(local_910.ray + 0x218) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x218);
                      *(uint *)(local_910.ray + 0x21c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x21c);
                      auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xa0));
                      *(undefined1 (*) [32])(local_910.ray + 0x220) = auVar103;
                      auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xc0));
                      *(undefined1 (*) [32])(local_910.ray + 0x240) = auVar103;
                      auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xe0));
                      *(undefined1 (*) [32])(local_910.ray + 0x260) = auVar103;
                      auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0x100));
                      *(undefined1 (*) [32])(local_910.ray + 0x280) = auVar103;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar186;
                  break;
                }
              }
              lVar73 = lVar73 + -1;
            } while (lVar73 != 0);
            uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar165._4_4_ = uVar169;
            auVar165._0_4_ = uVar169;
            auVar165._8_4_ = uVar169;
            auVar165._12_4_ = uVar169;
            auVar165._16_4_ = uVar169;
            auVar165._20_4_ = uVar169;
            auVar165._24_4_ = uVar169;
            auVar165._28_4_ = uVar169;
            auVar61._4_4_ = fStack_4bc;
            auVar61._0_4_ = local_4c0;
            auVar61._8_4_ = fStack_4b8;
            auVar61._12_4_ = fStack_4b4;
            auVar61._16_4_ = fStack_4b0;
            auVar61._20_4_ = fStack_4ac;
            auVar61._24_4_ = fStack_4a8;
            auVar61._28_4_ = fStack_4a4;
            uVar27 = vcmpps_avx512vl(auVar165,auVar61,0xd);
            bVar71 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar71 & (byte)uVar27;
          } while (bVar71 != 0);
          auVar105 = local_2a0;
        }
        bVar68 = local_4e0[0] | ~bVar68;
        auVar182._0_4_ = (float)local_7c0._0_4_ + auVar105._0_4_;
        auVar182._4_4_ = (float)local_7c0._4_4_ + auVar105._4_4_;
        auVar182._8_4_ = fStack_7b8 + auVar105._8_4_;
        auVar182._12_4_ = fStack_7b4 + auVar105._12_4_;
        auVar182._16_4_ = fStack_7b0 + auVar105._16_4_;
        auVar182._20_4_ = fStack_7ac + auVar105._20_4_;
        auVar182._24_4_ = fStack_7a8 + auVar105._24_4_;
        auVar182._28_4_ = fStack_7a4 + auVar105._28_4_;
        uVar27 = vcmpps_avx512vl(auVar182,auVar165,2);
        bVar63 = (byte)uVar28 & bVar63 & (byte)uVar27;
        auVar183._8_4_ = 2;
        auVar183._0_8_ = 0x200000002;
        auVar183._12_4_ = 2;
        auVar183._16_4_ = 2;
        auVar183._20_4_ = 2;
        auVar183._24_4_ = 2;
        auVar183._28_4_ = 2;
        auVar45._8_4_ = 3;
        auVar45._0_8_ = 0x300000003;
        auVar45._12_4_ = 3;
        auVar45._16_4_ = 3;
        auVar45._20_4_ = 3;
        auVar45._24_4_ = 3;
        auVar45._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar183,auVar45);
        auVar138._0_4_ = (uint)(bVar68 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar16 = (bool)(bVar68 >> 1 & 1);
        auVar138._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar68 >> 2 & 1);
        auVar138._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar68 >> 3 & 1);
        auVar138._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar68 >> 4 & 1);
        auVar138._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar68 >> 5 & 1);
        auVar138._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar68 >> 6 & 1);
        auVar138._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 2;
        auVar138._28_4_ = (uint)(bVar68 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        uVar27 = vpcmpd_avx512vl(local_460,auVar138,5);
        bVar68 = (byte)uVar27 & bVar63;
        fVar167 = (float)local_7c0._0_4_;
        fVar184 = (float)local_7c0._4_4_;
        fVar186 = fStack_7b8;
        fVar188 = fStack_7b4;
        fVar149 = fStack_7b0;
        fVar190 = fStack_7ac;
        fVar192 = fStack_7a8;
        fVar194 = fStack_7a4;
        if (bVar68 != 0) {
          auVar86 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar85 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar24 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar87 = vminps_avx(auVar86,auVar24);
          auVar86 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar24 = vmaxps_avx(auVar85,auVar86);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar87,auVar207);
          auVar86 = vandps_avx(auVar24,auVar207);
          auVar85 = vmaxps_avx(auVar85,auVar86);
          auVar86 = vmovshdup_avx(auVar85);
          auVar86 = vmaxss_avx(auVar86,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar86);
          fVar167 = auVar85._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar24,auVar24,0xff);
          local_4c0 = (float)local_7c0._0_4_ + local_2e0._0_4_;
          fStack_4bc = (float)local_7c0._4_4_ + local_2e0._4_4_;
          fStack_4b8 = fStack_7b8 + local_2e0._8_4_;
          fStack_4b4 = fStack_7b4 + local_2e0._12_4_;
          fStack_4b0 = fStack_7b0 + local_2e0._16_4_;
          fStack_4ac = fStack_7ac + local_2e0._20_4_;
          fStack_4a8 = fStack_7a8 + local_2e0._24_4_;
          fStack_4a4 = fStack_7a4 + local_2e0._28_4_;
          _local_6c0 = local_2e0;
          local_4e0 = auVar138;
          do {
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar166,_local_6c0);
            auVar139._0_4_ =
                 (uint)(bVar68 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar16 = (bool)(bVar68 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar68 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar68 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar68 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar68 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
            auVar139._24_4_ =
                 (uint)(bVar68 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar103 = vminps_avx(auVar139,auVar103);
            auVar105 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar105);
            auVar105 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar105);
            uVar27 = vcmpps_avx512vl(auVar139,auVar103,0);
            bVar65 = (byte)uVar27 & bVar68;
            bVar71 = bVar68;
            if (bVar65 != 0) {
              bVar71 = bVar65;
            }
            iVar2 = 0;
            for (uVar78 = (uint)bVar71; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar78 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
            fVar184 = auVar83._0_4_;
            auVar85 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar2 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar2 << 2)));
              fVar184 = sqrtf((float)local_800._0_4_);
              auVar85 = local_880._0_16_;
            }
            auVar85 = vinsertps_avx(auVar85,ZEXT416(uVar78),0x10);
            lVar73 = 5;
            do {
              uVar169 = auVar85._0_4_;
              auVar158._4_4_ = uVar169;
              auVar158._0_4_ = uVar169;
              auVar158._8_4_ = uVar169;
              auVar158._12_4_ = uVar169;
              auVar24 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_7f0);
              auVar86 = vmovshdup_avx(auVar85);
              local_5a0._0_16_ = auVar86;
              fVar192 = 1.0 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar85,auVar85,0x55);
              fVar186 = auVar86._0_4_;
              auVar208._0_4_ = local_680._0_4_ * fVar186;
              fVar188 = auVar86._4_4_;
              auVar208._4_4_ = local_680._4_4_ * fVar188;
              fVar149 = auVar86._8_4_;
              auVar208._8_4_ = local_680._8_4_ * fVar149;
              fVar190 = auVar86._12_4_;
              auVar208._12_4_ = local_680._12_4_ * fVar190;
              _local_580 = ZEXT416((uint)fVar192);
              auVar230._4_4_ = fVar192;
              auVar230._0_4_ = fVar192;
              auVar230._8_4_ = fVar192;
              auVar230._12_4_ = fVar192;
              auVar86 = vfmadd231ps_fma(auVar208,auVar230,local_640._0_16_);
              auVar244._0_4_ = local_660._0_4_ * fVar186;
              auVar244._4_4_ = local_660._4_4_ * fVar188;
              auVar244._8_4_ = local_660._8_4_ * fVar149;
              auVar244._12_4_ = local_660._12_4_ * fVar190;
              auVar87 = vfmadd231ps_fma(auVar244,auVar230,local_680._0_16_);
              auVar258._0_4_ = fVar186 * (float)local_6a0._0_4_;
              auVar258._4_4_ = fVar188 * (float)local_6a0._4_4_;
              auVar258._8_4_ = fVar149 * fStack_698;
              auVar258._12_4_ = fVar190 * fStack_694;
              auVar88 = vfmadd231ps_fma(auVar258,auVar230,local_660._0_16_);
              auVar266._0_4_ = fVar186 * auVar87._0_4_;
              auVar266._4_4_ = fVar188 * auVar87._4_4_;
              auVar266._8_4_ = fVar149 * auVar87._8_4_;
              auVar266._12_4_ = fVar190 * auVar87._12_4_;
              auVar86 = vfmadd231ps_fma(auVar266,auVar230,auVar86);
              auVar209._0_4_ = fVar186 * auVar88._0_4_;
              auVar209._4_4_ = fVar188 * auVar88._4_4_;
              auVar209._8_4_ = fVar149 * auVar88._8_4_;
              auVar209._12_4_ = fVar190 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar209,auVar230,auVar87);
              auVar245._0_4_ = fVar186 * auVar87._0_4_;
              auVar245._4_4_ = fVar188 * auVar87._4_4_;
              auVar245._8_4_ = fVar149 * auVar87._8_4_;
              auVar245._12_4_ = fVar190 * auVar87._12_4_;
              auVar88 = vfmadd231ps_fma(auVar245,auVar86,auVar230);
              auVar86 = vsubps_avx(auVar87,auVar86);
              auVar38._8_4_ = 0x40400000;
              auVar38._0_8_ = 0x4040000040400000;
              auVar38._12_4_ = 0x40400000;
              auVar87 = vmulps_avx512vl(auVar86,auVar38);
              local_560._0_16_ = auVar88;
              auVar24 = vsubps_avx(auVar24,auVar88);
              auVar86 = vdpps_avx(auVar24,auVar24,0x7f);
              local_880._0_16_ = auVar86;
              local_780 = ZEXT1632(auVar85);
              if (auVar86._0_4_ < 0.0) {
                auVar278._0_4_ = sqrtf(auVar86._0_4_);
                auVar278._4_60_ = extraout_var_00;
                auVar85 = auVar278._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar86,auVar86);
              }
              local_5c0._0_16_ = vdpps_avx(auVar87,auVar87,0x7f);
              fVar186 = local_5c0._0_4_;
              auVar210._4_12_ = ZEXT812(0) << 0x20;
              auVar210._0_4_ = fVar186;
              local_820._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              fVar188 = local_820._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              auVar39._8_4_ = 0x80000000;
              auVar39._0_8_ = 0x8000000080000000;
              auVar39._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_5c0._0_16_,auVar39);
              auVar86 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar86._0_4_;
              local_7a0._0_4_ = auVar85._0_4_;
              if (fVar186 < auVar88._0_4_) {
                fVar149 = sqrtf(fVar186);
                auVar85 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar86 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar149 = auVar86._0_4_;
              }
              fVar190 = local_820._0_4_;
              auVar84 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar188 * 1.5 +
                                                 fVar186 * -0.5 * fVar190 * fVar190 * fVar190)));
              auVar88 = vmulps_avx512vl(auVar87,auVar84);
              local_820._0_16_ = vdpps_avx(auVar24,auVar88,0x7f);
              auVar90 = vaddss_avx512f(auVar85,ZEXT416(0x3f800000));
              auVar159._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar159._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar159._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar159._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar86 = vsubps_avx(local_880._0_16_,auVar159);
              fVar186 = auVar86._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar186;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar92 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              in_ZMM26 = ZEXT1664(auVar92);
              auVar91 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              uVar75 = fVar186 == 0.0;
              uVar74 = fVar186 < 0.0;
              if ((bool)uVar74) {
                local_6f0._0_4_ = auVar92._0_4_;
                _local_710 = auVar84;
                local_700 = auVar88;
                local_6e0 = auVar89;
                fVar186 = sqrtf(fVar186);
                auVar91 = ZEXT416(auVar91._0_4_);
                in_ZMM26 = ZEXT464((uint)local_6f0._0_4_);
                auVar85 = ZEXT416((uint)local_7a0._0_4_);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar88 = local_700;
                auVar89 = local_6e0;
                auVar84 = _local_710;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar186 = auVar86._0_4_;
              }
              auVar279 = ZEXT1664(auVar88);
              auVar282 = ZEXT3264(local_840);
              auVar278 = ZEXT3264(local_8a0);
              auVar280 = ZEXT3264(local_8c0);
              auVar281 = ZEXT3264(local_8e0);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar188 = auVar86._0_4_ * 6.0;
              fVar190 = local_5a0._0_4_ * 6.0;
              auVar231._0_4_ = fVar190 * (float)local_6a0._0_4_;
              auVar231._4_4_ = fVar190 * (float)local_6a0._4_4_;
              auVar231._8_4_ = fVar190 * fStack_698;
              auVar231._12_4_ = fVar190 * fStack_694;
              auVar211._4_4_ = fVar188;
              auVar211._0_4_ = fVar188;
              auVar211._8_4_ = fVar188;
              auVar211._12_4_ = fVar188;
              auVar86 = vfmadd132ps_fma(auVar211,auVar231,local_660._0_16_);
              fVar188 = auVar92._0_4_ * 6.0;
              auVar178._4_4_ = fVar188;
              auVar178._0_4_ = fVar188;
              auVar178._8_4_ = fVar188;
              auVar178._12_4_ = fVar188;
              auVar86 = vfmadd132ps_fma(auVar178,auVar86,local_680._0_16_);
              fVar188 = local_580._0_4_ * 6.0;
              auVar212._4_4_ = fVar188;
              auVar212._0_4_ = fVar188;
              auVar212._8_4_ = fVar188;
              auVar212._12_4_ = fVar188;
              auVar86 = vfmadd132ps_fma(auVar212,auVar86,local_640._0_16_);
              auVar179._0_4_ = auVar86._0_4_ * (float)local_5c0._0_4_;
              auVar179._4_4_ = auVar86._4_4_ * (float)local_5c0._0_4_;
              auVar179._8_4_ = auVar86._8_4_ * (float)local_5c0._0_4_;
              auVar179._12_4_ = auVar86._12_4_ * (float)local_5c0._0_4_;
              auVar86 = vdpps_avx(auVar87,auVar86,0x7f);
              fVar188 = auVar86._0_4_;
              auVar213._0_4_ = auVar87._0_4_ * fVar188;
              auVar213._4_4_ = auVar87._4_4_ * fVar188;
              auVar213._8_4_ = auVar87._8_4_ * fVar188;
              auVar213._12_4_ = auVar87._12_4_ * fVar188;
              auVar86 = vsubps_avx(auVar179,auVar213);
              fVar188 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar92 = vmaxss_avx(ZEXT416((uint)fVar167),
                                   ZEXT416((uint)(local_780._0_4_ * fVar184 * 1.9073486e-06)));
              auVar214._0_4_ = auVar86._0_4_ * fVar188;
              auVar214._4_4_ = auVar86._4_4_ * fVar188;
              auVar214._8_4_ = auVar86._8_4_ * fVar188;
              auVar214._12_4_ = auVar86._12_4_ * fVar188;
              auVar40._8_4_ = 0x80000000;
              auVar40._0_8_ = 0x8000000080000000;
              auVar40._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(auVar87,auVar40);
              auVar94 = vmulps_avx512vl(auVar84,auVar214);
              auVar86 = vdpps_avx(auVar93,auVar88,0x7f);
              auVar84 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar167),auVar92);
              auVar85 = vdpps_avx(auVar24,auVar94,0x7f);
              vfmadd213ss_avx512f(auVar90,ZEXT416((uint)(fVar167 / fVar149)),auVar84);
              fVar188 = auVar86._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_7f0,auVar88,0x7f);
              auVar86 = vdpps_avx(auVar24,auVar93,0x7f);
              auVar84 = vmulss_avx512f(auVar91,auVar89);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar90 = vaddss_avx512f(in_ZMM26._0_16_,
                                       ZEXT416((uint)(auVar84._0_4_ * auVar89._0_4_)));
              auVar84 = vdpps_avx(auVar24,local_7f0,0x7f);
              auVar91 = vfnmadd231ss_avx512f(auVar86,local_820._0_16_,ZEXT416((uint)fVar188));
              auVar84 = vfnmadd231ss_avx512f(auVar84,local_820._0_16_,auVar85);
              auVar86 = vpermilps_avx(local_560._0_16_,0xff);
              fVar186 = fVar186 - auVar86._0_4_;
              auVar89 = vshufps_avx(auVar87,auVar87,0xff);
              auVar86 = vfmsub213ss_fma(auVar91,auVar90,auVar89);
              auVar272._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar272._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar272._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar84 = ZEXT416((uint)(auVar84._0_4_ * auVar90._0_4_));
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar188),auVar84);
              auVar86 = vinsertps_avx(auVar272,auVar84,0x1c);
              auVar259._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar188),auVar259,0x10);
              auVar232._0_4_ = auVar90._0_4_;
              auVar232._4_4_ = auVar232._0_4_;
              auVar232._8_4_ = auVar232._0_4_;
              auVar232._12_4_ = auVar232._0_4_;
              auVar85 = vdivps_avx(auVar86,auVar232);
              auVar86 = vdivps_avx(auVar84,auVar232);
              auVar84 = vbroadcastss_avx512vl(local_820._0_16_);
              auVar233._0_4_ = auVar84._0_4_ * auVar85._0_4_ + fVar186 * auVar86._0_4_;
              auVar233._4_4_ = auVar84._4_4_ * auVar85._4_4_ + fVar186 * auVar86._4_4_;
              auVar233._8_4_ = auVar84._8_4_ * auVar85._8_4_ + fVar186 * auVar86._8_4_;
              auVar233._12_4_ = auVar84._12_4_ * auVar85._12_4_ + fVar186 * auVar86._12_4_;
              auVar85 = vsubps_avx(local_780._0_16_,auVar233);
              auVar41._8_4_ = 0x7fffffff;
              auVar41._0_8_ = 0x7fffffff7fffffff;
              auVar41._12_4_ = 0x7fffffff;
              auVar86 = vandps_avx512vl(local_820._0_16_,auVar41);
              auVar86 = vucomiss_avx512f(auVar86);
              if (!(bool)uVar74 && !(bool)uVar75) {
                auVar86 = vaddss_avx512f(auVar92,auVar86);
                auVar86 = vfmadd231ss_fma(auVar86,local_720,ZEXT416(0x36000000));
                auVar42._8_4_ = 0x7fffffff;
                auVar42._0_8_ = 0x7fffffff7fffffff;
                auVar42._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar186),auVar42);
                if (auVar84._0_4_ < auVar86._0_4_) {
                  fVar184 = auVar85._0_4_ + (float)local_730._0_4_;
                  if ((fVar184 < fVar148) ||
                     (fVar186 = *(float *)(ray + k * 4 + 0x100), fVar186 < fVar184)) break;
                  auVar86 = vmovshdup_avx(auVar85);
                  fVar188 = auVar86._0_4_;
                  if ((fVar188 < 0.0) || (1.0 < fVar188)) break;
                  auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_880._0_4_));
                  fVar149 = auVar86._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar72].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar149 = fVar149 * 1.5 +
                            (float)local_880._0_4_ * -0.5 * fVar149 * fVar149 * fVar149;
                  auVar234._0_4_ = auVar24._0_4_ * fVar149;
                  auVar234._4_4_ = auVar24._4_4_ * fVar149;
                  auVar234._8_4_ = auVar24._8_4_ * fVar149;
                  auVar234._12_4_ = auVar24._12_4_ * fVar149;
                  auVar84 = vfmadd213ps_fma(auVar89,auVar234,auVar87);
                  auVar86 = vshufps_avx(auVar234,auVar234,0xc9);
                  auVar24 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar235._0_4_ = auVar234._0_4_ * auVar24._0_4_;
                  auVar235._4_4_ = auVar234._4_4_ * auVar24._4_4_;
                  auVar235._8_4_ = auVar234._8_4_ * auVar24._8_4_;
                  auVar235._12_4_ = auVar234._12_4_ * auVar24._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar235,auVar87,auVar86);
                  auVar86 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar24 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar160._0_4_ = auVar84._0_4_ * auVar87._0_4_;
                  auVar160._4_4_ = auVar84._4_4_ * auVar87._4_4_;
                  auVar160._8_4_ = auVar84._8_4_ * auVar87._8_4_;
                  auVar160._12_4_ = auVar84._12_4_ * auVar87._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar160,auVar86,auVar24);
                  uVar169 = auVar86._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar184;
                    uVar8 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar169;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar188;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar72;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar15 = context->user;
                  auVar238._8_4_ = 1;
                  auVar238._0_8_ = 0x100000001;
                  auVar238._12_4_ = 1;
                  auVar238._16_4_ = 1;
                  auVar238._20_4_ = 1;
                  auVar238._24_4_ = 1;
                  auVar238._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar238,ZEXT1632(auVar85));
                  auVar103 = vpermps_avx2(auVar238,ZEXT1632(auVar86));
                  auVar248._8_4_ = 2;
                  auVar248._0_8_ = 0x200000002;
                  auVar248._12_4_ = 2;
                  auVar248._16_4_ = 2;
                  auVar248._20_4_ = 2;
                  auVar248._24_4_ = 2;
                  auVar248._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar248,ZEXT1632(auVar86));
                  local_400[0] = (RTCHitN)auVar103[0];
                  local_400[1] = (RTCHitN)auVar103[1];
                  local_400[2] = (RTCHitN)auVar103[2];
                  local_400[3] = (RTCHitN)auVar103[3];
                  local_400[4] = (RTCHitN)auVar103[4];
                  local_400[5] = (RTCHitN)auVar103[5];
                  local_400[6] = (RTCHitN)auVar103[6];
                  local_400[7] = (RTCHitN)auVar103[7];
                  local_400[8] = (RTCHitN)auVar103[8];
                  local_400[9] = (RTCHitN)auVar103[9];
                  local_400[10] = (RTCHitN)auVar103[10];
                  local_400[0xb] = (RTCHitN)auVar103[0xb];
                  local_400[0xc] = (RTCHitN)auVar103[0xc];
                  local_400[0xd] = (RTCHitN)auVar103[0xd];
                  local_400[0xe] = (RTCHitN)auVar103[0xe];
                  local_400[0xf] = (RTCHitN)auVar103[0xf];
                  local_400[0x10] = (RTCHitN)auVar103[0x10];
                  local_400[0x11] = (RTCHitN)auVar103[0x11];
                  local_400[0x12] = (RTCHitN)auVar103[0x12];
                  local_400[0x13] = (RTCHitN)auVar103[0x13];
                  local_400[0x14] = (RTCHitN)auVar103[0x14];
                  local_400[0x15] = (RTCHitN)auVar103[0x15];
                  local_400[0x16] = (RTCHitN)auVar103[0x16];
                  local_400[0x17] = (RTCHitN)auVar103[0x17];
                  local_400[0x18] = (RTCHitN)auVar103[0x18];
                  local_400[0x19] = (RTCHitN)auVar103[0x19];
                  local_400[0x1a] = (RTCHitN)auVar103[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar103[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar103[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar103[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar103[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar103[0x1f];
                  local_3c0 = uVar169;
                  uStack_3bc = uVar169;
                  uStack_3b8 = uVar169;
                  uStack_3b4 = uVar169;
                  uStack_3b0 = uVar169;
                  uStack_3ac = uVar169;
                  uStack_3a8 = uVar169;
                  uStack_3a4 = uVar169;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_440._0_8_;
                  uStack_358 = local_440._8_8_;
                  uStack_350 = local_440._16_8_;
                  uStack_348 = local_440._24_8_;
                  local_340 = local_420;
                  auVar103 = vpcmpeqd_avx2(local_420,local_420);
                  local_848[1] = auVar103;
                  *local_848 = auVar103;
                  local_320 = pRVar15->instID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  local_300 = pRVar15->instPrimID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  *(float *)(ray + k * 4 + 0x100) = fVar184;
                  local_760 = local_480;
                  local_910.valid = (int *)local_760;
                  local_910.geometryUserPtr = pGVar9->userPtr;
                  local_910.context = context->user;
                  local_910.hit = local_400;
                  local_910.N = 8;
                  local_910.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar279 = ZEXT1664(auVar88);
                    (*pGVar9->intersectionFilterN)(&local_910);
                    auVar281 = ZEXT3264(local_8e0);
                    auVar280 = ZEXT3264(local_8c0);
                    auVar278 = ZEXT3264(local_8a0);
                    auVar282 = ZEXT3264(local_840);
                  }
                  if (local_760 != (undefined1  [32])0x0) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      (*p_Var14)(&local_910);
                      auVar281 = ZEXT3264(local_8e0);
                      auVar280 = ZEXT3264(local_8c0);
                      auVar278 = ZEXT3264(local_8a0);
                      auVar282 = ZEXT3264(local_840);
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      uVar76 = vptestmd_avx512vl(local_760,local_760);
                      iVar3 = *(int *)(local_910.hit + 4);
                      iVar4 = *(int *)(local_910.hit + 8);
                      iVar1 = *(int *)(local_910.hit + 0xc);
                      iVar57 = *(int *)(local_910.hit + 0x10);
                      iVar58 = *(int *)(local_910.hit + 0x14);
                      iVar59 = *(int *)(local_910.hit + 0x18);
                      iVar60 = *(int *)(local_910.hit + 0x1c);
                      bVar71 = (byte)uVar76;
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x180) =
                           (uint)(bVar71 & 1) * *(int *)local_910.hit |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_910.ray + 0x180);
                      *(uint *)(local_910.ray + 0x184) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x184);
                      *(uint *)(local_910.ray + 0x188) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x188);
                      *(uint *)(local_910.ray + 0x18c) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x18c);
                      *(uint *)(local_910.ray + 400) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 400);
                      *(uint *)(local_910.ray + 0x194) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x194);
                      *(uint *)(local_910.ray + 0x198) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x198);
                      *(uint *)(local_910.ray + 0x19c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x19c);
                      iVar3 = *(int *)(local_910.hit + 0x24);
                      iVar4 = *(int *)(local_910.hit + 0x28);
                      iVar1 = *(int *)(local_910.hit + 0x2c);
                      iVar57 = *(int *)(local_910.hit + 0x30);
                      iVar58 = *(int *)(local_910.hit + 0x34);
                      iVar59 = *(int *)(local_910.hit + 0x38);
                      iVar60 = *(int *)(local_910.hit + 0x3c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1a0) =
                           (uint)(bVar71 & 1) * *(int *)(local_910.hit + 0x20) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_910.ray + 0x1a0);
                      *(uint *)(local_910.ray + 0x1a4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1a4);
                      *(uint *)(local_910.ray + 0x1a8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1a8);
                      *(uint *)(local_910.ray + 0x1ac) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1ac);
                      *(uint *)(local_910.ray + 0x1b0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1b0);
                      *(uint *)(local_910.ray + 0x1b4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x1b4);
                      *(uint *)(local_910.ray + 0x1b8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1b8);
                      *(uint *)(local_910.ray + 0x1bc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1bc);
                      iVar3 = *(int *)(local_910.hit + 0x44);
                      iVar4 = *(int *)(local_910.hit + 0x48);
                      iVar1 = *(int *)(local_910.hit + 0x4c);
                      iVar57 = *(int *)(local_910.hit + 0x50);
                      iVar58 = *(int *)(local_910.hit + 0x54);
                      iVar59 = *(int *)(local_910.hit + 0x58);
                      iVar60 = *(int *)(local_910.hit + 0x5c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1c0) =
                           (uint)(bVar71 & 1) * *(int *)(local_910.hit + 0x40) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_910.ray + 0x1c0);
                      *(uint *)(local_910.ray + 0x1c4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1c4);
                      *(uint *)(local_910.ray + 0x1c8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1c8);
                      *(uint *)(local_910.ray + 0x1cc) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1cc);
                      *(uint *)(local_910.ray + 0x1d0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1d0);
                      *(uint *)(local_910.ray + 0x1d4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x1d4);
                      *(uint *)(local_910.ray + 0x1d8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1d8);
                      *(uint *)(local_910.ray + 0x1dc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1dc);
                      iVar3 = *(int *)(local_910.hit + 100);
                      iVar4 = *(int *)(local_910.hit + 0x68);
                      iVar1 = *(int *)(local_910.hit + 0x6c);
                      iVar57 = *(int *)(local_910.hit + 0x70);
                      iVar58 = *(int *)(local_910.hit + 0x74);
                      iVar59 = *(int *)(local_910.hit + 0x78);
                      iVar60 = *(int *)(local_910.hit + 0x7c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x1e0) =
                           (uint)(bVar71 & 1) * *(int *)(local_910.hit + 0x60) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_910.ray + 0x1e0);
                      *(uint *)(local_910.ray + 0x1e4) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x1e4);
                      *(uint *)(local_910.ray + 0x1e8) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x1e8);
                      *(uint *)(local_910.ray + 0x1ec) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x1ec);
                      *(uint *)(local_910.ray + 0x1f0) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x1f0);
                      *(uint *)(local_910.ray + 500) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 500);
                      *(uint *)(local_910.ray + 0x1f8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x1f8);
                      *(uint *)(local_910.ray + 0x1fc) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x1fc);
                      iVar3 = *(int *)(local_910.hit + 0x84);
                      iVar4 = *(int *)(local_910.hit + 0x88);
                      iVar1 = *(int *)(local_910.hit + 0x8c);
                      iVar57 = *(int *)(local_910.hit + 0x90);
                      iVar58 = *(int *)(local_910.hit + 0x94);
                      iVar59 = *(int *)(local_910.hit + 0x98);
                      iVar60 = *(int *)(local_910.hit + 0x9c);
                      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar22 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_910.ray + 0x200) =
                           (uint)(bVar71 & 1) * *(int *)(local_910.hit + 0x80) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_910.ray + 0x200);
                      *(uint *)(local_910.ray + 0x204) =
                           (uint)bVar16 * iVar3 | (uint)!bVar16 * *(int *)(local_910.ray + 0x204);
                      *(uint *)(local_910.ray + 0x208) =
                           (uint)bVar17 * iVar4 | (uint)!bVar17 * *(int *)(local_910.ray + 0x208);
                      *(uint *)(local_910.ray + 0x20c) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_910.ray + 0x20c);
                      *(uint *)(local_910.ray + 0x210) =
                           (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_910.ray + 0x210);
                      *(uint *)(local_910.ray + 0x214) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_910.ray + 0x214);
                      *(uint *)(local_910.ray + 0x218) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_910.ray + 0x218);
                      *(uint *)(local_910.ray + 0x21c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_910.ray + 0x21c);
                      auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xa0));
                      *(undefined1 (*) [32])(local_910.ray + 0x220) = auVar103;
                      auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xc0));
                      *(undefined1 (*) [32])(local_910.ray + 0x240) = auVar103;
                      auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0xe0));
                      *(undefined1 (*) [32])(local_910.ray + 0x260) = auVar103;
                      auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_910.hit + 0x100));
                      *(undefined1 (*) [32])(local_910.ray + 0x280) = auVar103;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar186;
                  break;
                }
              }
              lVar73 = lVar73 + -1;
            } while (lVar73 != 0);
            uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar165._4_4_ = uVar169;
            auVar165._0_4_ = uVar169;
            auVar165._8_4_ = uVar169;
            auVar165._12_4_ = uVar169;
            auVar165._16_4_ = uVar169;
            auVar165._20_4_ = uVar169;
            auVar165._24_4_ = uVar169;
            auVar165._28_4_ = uVar169;
            auVar62._4_4_ = fStack_4bc;
            auVar62._0_4_ = local_4c0;
            auVar62._8_4_ = fStack_4b8;
            auVar62._12_4_ = fStack_4b4;
            auVar62._16_4_ = fStack_4b0;
            auVar62._20_4_ = fStack_4ac;
            auVar62._24_4_ = fStack_4a8;
            auVar62._28_4_ = fStack_4a4;
            uVar27 = vcmpps_avx512vl(auVar165,auVar62,0xd);
            bVar68 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar68 & (byte)uVar27;
          } while (bVar68 != 0);
          auVar138 = local_4e0;
          fVar167 = (float)local_7c0._0_4_;
          fVar184 = (float)local_7c0._4_4_;
          fVar186 = fStack_7b8;
          fVar188 = fStack_7b4;
          fVar149 = fStack_7b0;
          fVar190 = fStack_7ac;
          fVar192 = fStack_7a8;
          fVar194 = fStack_7a4;
        }
        auVar249 = ZEXT3264(local_7e0);
        uVar28 = vpcmpgtd_avx512vl(auVar138,local_460);
        uVar29 = vpcmpd_avx512vl(local_460,local_280,1);
        auVar219._0_4_ = fVar167 + (float)local_200._0_4_;
        auVar219._4_4_ = fVar184 + (float)local_200._4_4_;
        auVar219._8_4_ = fVar186 + fStack_1f8;
        auVar219._12_4_ = fVar188 + fStack_1f4;
        auVar219._16_4_ = fVar149 + fStack_1f0;
        auVar219._20_4_ = fVar190 + fStack_1ec;
        auVar219._24_4_ = fVar192 + fStack_1e8;
        auVar219._28_4_ = fVar194 + fStack_1e4;
        uVar27 = vcmpps_avx512vl(auVar219,auVar165,2);
        bVar67 = bVar67 & (byte)uVar29 & (byte)uVar27;
        auVar220._0_4_ = fVar167 + local_2e0._0_4_;
        auVar220._4_4_ = fVar184 + local_2e0._4_4_;
        auVar220._8_4_ = fVar186 + local_2e0._8_4_;
        auVar220._12_4_ = fVar188 + local_2e0._12_4_;
        auVar220._16_4_ = fVar149 + local_2e0._16_4_;
        auVar220._20_4_ = fVar190 + local_2e0._20_4_;
        auVar220._24_4_ = fVar192 + local_2e0._24_4_;
        auVar220._28_4_ = fVar194 + local_2e0._28_4_;
        uVar27 = vcmpps_avx512vl(auVar220,auVar165,2);
        bVar63 = bVar63 & (byte)uVar28 & (byte)uVar27 | bVar67;
        auVar268 = ZEXT3264(local_620);
        prim = local_6d0;
        if (bVar63 != 0) {
          uVar66 = (ulong)uVar70;
          abStack_180[uVar66 * 0x60] = bVar63;
          auVar140._0_4_ =
               (uint)(bVar67 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar67 & 1) * (int)local_2e0._0_4_;
          bVar16 = (bool)(bVar67 >> 1 & 1);
          auVar140._4_4_ = (uint)bVar16 * local_200._4_4_ | (uint)!bVar16 * (int)local_2e0._4_4_;
          bVar16 = (bool)(bVar67 >> 2 & 1);
          auVar140._8_4_ = (uint)bVar16 * (int)fStack_1f8 | (uint)!bVar16 * (int)local_2e0._8_4_;
          bVar16 = (bool)(bVar67 >> 3 & 1);
          auVar140._12_4_ = (uint)bVar16 * (int)fStack_1f4 | (uint)!bVar16 * (int)local_2e0._12_4_;
          bVar16 = (bool)(bVar67 >> 4 & 1);
          auVar140._16_4_ = (uint)bVar16 * (int)fStack_1f0 | (uint)!bVar16 * (int)local_2e0._16_4_;
          bVar16 = (bool)(bVar67 >> 5 & 1);
          auVar140._20_4_ = (uint)bVar16 * (int)fStack_1ec | (uint)!bVar16 * (int)local_2e0._20_4_;
          auVar140._24_4_ =
               (uint)(bVar67 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar67 >> 6) * (int)local_2e0._24_4_;
          auVar140._28_4_ = local_2e0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar140;
          uVar76 = vmovlps_avx(local_490);
          (&uStack_140)[uVar66 * 0xc] = uVar76;
          aiStack_138[uVar66 * 0x18] = local_af4 + 1;
          uVar70 = uVar70 + 1;
        }
      }
    }
    do {
      uVar78 = uVar70;
      uVar77 = uVar78 - 1;
      if (uVar78 == 0) {
        uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar43._4_4_ = uVar169;
        auVar43._0_4_ = uVar169;
        auVar43._8_4_ = uVar169;
        auVar43._12_4_ = uVar169;
        uVar27 = vcmpps_avx512vl(local_4a0,auVar43,2);
        uVar72 = (uint)uVar27 & (uint)local_6c8 - 1 & (uint)local_6c8;
        local_6c8 = (ulong)uVar72;
        if (uVar72 == 0) {
          return;
        }
        goto LAB_01bdcd74;
      }
      uVar76 = (ulong)uVar77;
      lVar73 = uVar76 * 0x60;
      auVar103 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar180._0_4_ = fVar167 + auVar103._0_4_;
      auVar180._4_4_ = fVar184 + auVar103._4_4_;
      auVar180._8_4_ = fVar186 + auVar103._8_4_;
      auVar180._12_4_ = fVar188 + auVar103._12_4_;
      auVar180._16_4_ = fVar149 + auVar103._16_4_;
      auVar180._20_4_ = fVar190 + auVar103._20_4_;
      auVar180._24_4_ = fVar192 + auVar103._24_4_;
      auVar180._28_4_ = fVar194 + auVar103._28_4_;
      uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar46._4_4_ = uVar169;
      auVar46._0_4_ = uVar169;
      auVar46._8_4_ = uVar169;
      auVar46._12_4_ = uVar169;
      auVar46._16_4_ = uVar169;
      auVar46._20_4_ = uVar169;
      auVar46._24_4_ = uVar169;
      auVar46._28_4_ = uVar169;
      uVar27 = vcmpps_avx512vl(auVar180,auVar46,2);
      uVar141 = (uint)uVar27 & (uint)abStack_180[lVar73];
      uVar70 = uVar77;
    } while (uVar141 == 0);
    uVar66 = (&uStack_140)[uVar76 * 0xc];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar66;
    auVar217._8_4_ = 0x7f800000;
    auVar217._0_8_ = 0x7f8000007f800000;
    auVar217._12_4_ = 0x7f800000;
    auVar217._16_4_ = 0x7f800000;
    auVar217._20_4_ = 0x7f800000;
    auVar217._24_4_ = 0x7f800000;
    auVar217._28_4_ = 0x7f800000;
    auVar105 = vblendmps_avx512vl(auVar217,auVar103);
    bVar63 = (byte)uVar141;
    auVar136._0_4_ =
         (uint)(bVar63 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)auVar103._0_4_;
    bVar16 = (bool)((byte)(uVar141 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * (int)auVar103._4_4_;
    bVar16 = (bool)((byte)(uVar141 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * (int)auVar103._8_4_;
    bVar16 = (bool)((byte)(uVar141 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * (int)auVar103._12_4_;
    bVar16 = (bool)((byte)(uVar141 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar16 * auVar105._16_4_ | (uint)!bVar16 * (int)auVar103._16_4_;
    bVar16 = (bool)((byte)(uVar141 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar16 * auVar105._20_4_ | (uint)!bVar16 * (int)auVar103._20_4_;
    bVar16 = (bool)((byte)(uVar141 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar16 * auVar105._24_4_ | (uint)!bVar16 * (int)auVar103._24_4_;
    auVar136._28_4_ =
         (uVar141 >> 7) * auVar105._28_4_ | (uint)!SUB41(uVar141 >> 7,0) * (int)auVar103._28_4_;
    auVar103 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar103 = vminps_avx(auVar136,auVar103);
    auVar105 = vshufpd_avx(auVar103,auVar103,5);
    auVar103 = vminps_avx(auVar103,auVar105);
    auVar105 = vpermpd_avx2(auVar103,0x4e);
    auVar103 = vminps_avx(auVar103,auVar105);
    uVar27 = vcmpps_avx512vl(auVar136,auVar103,0);
    bVar68 = (byte)uVar27 & bVar63;
    if (bVar68 != 0) {
      uVar141 = (uint)bVar68;
    }
    uVar142 = 0;
    for (; (uVar141 & 1) == 0; uVar141 = uVar141 >> 1 | 0x80000000) {
      uVar142 = uVar142 + 1;
    }
    local_af4 = aiStack_138[uVar76 * 0x18];
    bVar63 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar63;
    abStack_180[lVar73] = bVar63;
    uVar70 = uVar78;
    if (bVar63 == 0) {
      uVar70 = uVar77;
    }
    uVar169 = (undefined4)uVar66;
    auVar162._4_4_ = uVar169;
    auVar162._0_4_ = uVar169;
    auVar162._8_4_ = uVar169;
    auVar162._12_4_ = uVar169;
    auVar162._16_4_ = uVar169;
    auVar162._20_4_ = uVar169;
    auVar162._24_4_ = uVar169;
    auVar162._28_4_ = uVar169;
    auVar85 = vmovshdup_avx(auVar173);
    auVar85 = vsubps_avx(auVar85,auVar173);
    auVar181._0_4_ = auVar85._0_4_;
    auVar181._4_4_ = auVar181._0_4_;
    auVar181._8_4_ = auVar181._0_4_;
    auVar181._12_4_ = auVar181._0_4_;
    auVar181._16_4_ = auVar181._0_4_;
    auVar181._20_4_ = auVar181._0_4_;
    auVar181._24_4_ = auVar181._0_4_;
    auVar181._28_4_ = auVar181._0_4_;
    auVar85 = vfmadd132ps_fma(auVar181,auVar162,_DAT_01faff20);
    auVar103 = ZEXT1632(auVar85);
    local_400[0] = (RTCHitN)auVar103[0];
    local_400[1] = (RTCHitN)auVar103[1];
    local_400[2] = (RTCHitN)auVar103[2];
    local_400[3] = (RTCHitN)auVar103[3];
    local_400[4] = (RTCHitN)auVar103[4];
    local_400[5] = (RTCHitN)auVar103[5];
    local_400[6] = (RTCHitN)auVar103[6];
    local_400[7] = (RTCHitN)auVar103[7];
    local_400[8] = (RTCHitN)auVar103[8];
    local_400[9] = (RTCHitN)auVar103[9];
    local_400[10] = (RTCHitN)auVar103[10];
    local_400[0xb] = (RTCHitN)auVar103[0xb];
    local_400[0xc] = (RTCHitN)auVar103[0xc];
    local_400[0xd] = (RTCHitN)auVar103[0xd];
    local_400[0xe] = (RTCHitN)auVar103[0xe];
    local_400[0xf] = (RTCHitN)auVar103[0xf];
    local_400[0x10] = (RTCHitN)auVar103[0x10];
    local_400[0x11] = (RTCHitN)auVar103[0x11];
    local_400[0x12] = (RTCHitN)auVar103[0x12];
    local_400[0x13] = (RTCHitN)auVar103[0x13];
    local_400[0x14] = (RTCHitN)auVar103[0x14];
    local_400[0x15] = (RTCHitN)auVar103[0x15];
    local_400[0x16] = (RTCHitN)auVar103[0x16];
    local_400[0x17] = (RTCHitN)auVar103[0x17];
    local_400[0x18] = (RTCHitN)auVar103[0x18];
    local_400[0x19] = (RTCHitN)auVar103[0x19];
    local_400[0x1a] = (RTCHitN)auVar103[0x1a];
    local_400[0x1b] = (RTCHitN)auVar103[0x1b];
    local_400[0x1c] = (RTCHitN)auVar103[0x1c];
    local_400[0x1d] = (RTCHitN)auVar103[0x1d];
    local_400[0x1e] = (RTCHitN)auVar103[0x1e];
    local_400[0x1f] = (RTCHitN)auVar103[0x1f];
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_400 + (ulong)uVar142 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }